

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O3

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::NotDistinctFrom>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  SelectionVector *pSVar4;
  data_t *pdVar5;
  short *psVar6;
  data_ptr_t pdVar7;
  sel_t *psVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  element_type *peVar15;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  undefined1 auVar16 [8];
  undefined8 uVar17;
  ulong uVar18;
  _Head_base<0UL,_unsigned_long_*,_false> _Var19;
  Vector *pVVar20;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  int *piVar22;
  reference pvVar23;
  type pVVar24;
  SelectionVector *pSVar25;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar26;
  TemplatedValidityData<unsigned_long> *pTVar27;
  NotImplementedException *this_01;
  InternalException *this_02;
  ulong uVar28;
  optional_ptr<duckdb::SelectionVector,_true> oVar29;
  ulong uVar30;
  int *piVar31;
  long lVar32;
  idx_t iVar33;
  undefined4 uVar34;
  idx_t idx_in_entry;
  float *pfVar35;
  double *pdVar36;
  string_t *psVar37;
  uhugeint_t *puVar38;
  int iVar39;
  idx_t pos;
  long *plVar40;
  long *plVar41;
  float *pfVar42;
  double *pdVar43;
  string_t *psVar44;
  uhugeint_t *puVar45;
  sel_t sVar46;
  size_type __n;
  idx_t iVar47;
  long lVar48;
  idx_t iVar49;
  ulong uVar50;
  idx_t i_8;
  long lVar51;
  idx_t iVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  idx_t pos_1;
  idx_t iVar57;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar58;
  long lVar59;
  ulong uVar60;
  idx_t iVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  interval_t *left_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector slice_sel;
  SelectionVector maybe_vec;
  SelectionVector rcursor;
  SelectionVector lcursor;
  SelectionVector true_sel_2;
  SelectionVector true_sel_1;
  Vector lchild;
  Vector rchild;
  SelectionVector false_sel_1;
  OptionalSelection false_opt;
  UnifiedVectorFormat rvdata_1;
  UnifiedVectorFormat lvdata_1;
  OptionalSelection true_opt;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  ValidityMask *local_4d8;
  idx_t local_4d0;
  optional_ptr<duckdb::ValidityMask,_true> local_4c8;
  long local_4b8;
  idx_t local_4b0;
  undefined1 local_4a8 [8];
  LogicalType LStack_4a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  optional_ptr<duckdb::ValidityMask,_true> local_440;
  undefined1 local_438 [8];
  LogicalType LStack_430;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  sel_t *local_3c8;
  optional_ptr<duckdb::ValidityMask,_true> local_3c0;
  SelectionVector local_3b8;
  SelectionVector local_3a0;
  SelectionVector local_388;
  SelectionVector local_370;
  undefined1 local_358 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_320;
  Vector local_318;
  optional_ptr<duckdb::SelectionVector,_true> local_2b0;
  optional_ptr<duckdb::SelectionVector,_true> local_2a8;
  optional_ptr<const_duckdb::SelectionVector,_true> local_2a0;
  undefined1 local_298 [8];
  LogicalType aLStack_290 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  SelectionVector local_228;
  OptionalSelection local_210;
  UnifiedVectorFormat local_1f0;
  UnifiedVectorFormat local_1a8;
  long local_158;
  OptionalSelection local_150;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar1 = (left->type).physical_type_;
  if (199 < PVar1) {
    if (PVar1 != VARCHAR) {
      if (PVar1 == UINT128) {
        local_298 = (undefined1  [8])null_mask.ptr;
        if (sel.ptr == (SelectionVector *)0x0) {
          sel.ptr = FlatVector::IncrementalSelectionVector();
        }
        if (null_mask.ptr != (ValidityMask *)0x0) {
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
          UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
          UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
        }
        if (left->vector_type == FLAT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            puVar38 = (uhugeint_t *)left->data;
            puVar45 = (uhugeint_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return 0;
              }
              lVar48 = 0;
              iVar33 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar38,puVar45);
                }
                (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
                iVar33 = iVar33 + bVar62;
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
                uVar50 = uVar50 + 1;
                puVar38 = puVar38 + 1;
                puVar45 = puVar45 + 1;
              } while (count != uVar50);
              return iVar33;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return 0;
              }
              uVar50 = 0;
              iVar33 = 0;
              do {
                uVar30 = uVar50;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar38,puVar45);
                }
                (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
                iVar33 = iVar33 + bVar62;
                uVar50 = uVar50 + 1;
                puVar38 = puVar38 + 1;
                puVar45 = puVar45 + 1;
              } while (count != uVar50);
              return iVar33;
            }
            if (count != 0) {
              lVar48 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar38,puVar45);
                  bVar62 = !bVar62;
                }
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)bVar62;
                uVar50 = uVar50 + 1;
                puVar38 = puVar38 + 1;
                puVar45 = puVar45 + 1;
              } while (count != uVar50);
              goto LAB_00b61051;
            }
            goto LAB_00b6104e;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            puVar38 = (uhugeint_t *)right->data;
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar45 = (uhugeint_t *)left->data;
            _local_4a8 = (undefined1  [16])0x0;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
            if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
              local_318._0_8_ = 0x800;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_438,(unsigned_long *)&local_318);
              peVar15 = LStack_4a0.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              auVar16 = local_438;
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)LStack_430._0_8_;
              _local_438 = (undefined1  [16])0x0;
              auVar13 = _local_438;
              local_438[0] = auVar16[0];
              local_438[1] = auVar16[1];
              local_438._2_6_ = auVar16._2_6_;
              LStack_4a0.id_ = local_438[0];
              LStack_4a0.physical_type_ = local_438[1];
              LStack_4a0._2_6_ = local_438._2_6_;
              _local_438 = auVar13;
              if (peVar15 != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
                }
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(local_4a8 + 8));
              local_4a8 = *(undefined1 (*) [8])
                           &(pTVar27->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false>;
              *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
            }
            FlatVector::VerifyFlatVector(left);
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b62117;
                lVar48 = 0;
                uVar50 = 0;
                do {
                  uVar30 = uVar50;
                  if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                    uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                  }
                  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                  ;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                  }
                  if (local_4a8 == (undefined1  [8])0x0) {
                    bVar63 = false;
                  }
                  else {
                    bVar63 = (*(byte *)local_4a8 & 1) == 0;
                  }
                  if ((bVar62 | bVar63) == 1) {
                    bVar62 = (bool)(bVar62 ^ bVar63);
                  }
                  else {
                    bVar62 = uhugeint_t::operator==(puVar45,puVar38);
                    bVar62 = !bVar62;
                  }
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                  lVar48 = lVar48 + (ulong)bVar62;
                  uVar50 = uVar50 + 1;
                  puVar45 = puVar45 + 1;
                } while (count != uVar50);
                goto LAB_00b6211a;
              }
              if (count != 0) {
                uVar50 = 0;
                local_4d0 = 0;
                do {
                  uVar30 = uVar50;
                  if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                    uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                  }
                  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                  ;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                  }
                  if (local_4a8 == (undefined1  [8])0x0) {
                    bVar63 = false;
                  }
                  else {
                    bVar63 = (*(byte *)local_4a8 & 1) == 0;
                  }
                  if ((bVar62 | bVar63) == 1) {
                    bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                  }
                  else {
                    bVar62 = uhugeint_t::operator==(puVar45,puVar38);
                  }
                  (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
                  local_4d0 = local_4d0 + bVar62;
                  uVar50 = uVar50 + 1;
                  puVar45 = puVar45 + 1;
                  local_118.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          LStack_4a0.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
                } while (count != uVar50);
                goto LAB_00b62267;
              }
            }
            else if (count != 0) {
              lVar48 = 0;
              local_4d0 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar45,puVar38);
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
                local_4d0 = local_4d0 + bVar62;
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
                uVar50 = uVar50 + 1;
                puVar45 = puVar45 + 1;
                local_118.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        LStack_4a0.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
              } while (count != uVar50);
              goto LAB_00b62267;
            }
            goto LAB_00b5e975;
          }
        }
        else if (left->vector_type == CONSTANT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            puVar38 = (uhugeint_t *)left->data;
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar45 = (uhugeint_t *)right->data;
            _local_4a8 = (undefined1  [16])0x0;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
            if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
              local_318._0_8_ = 0x800;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_438,(unsigned_long *)&local_318);
              peVar15 = LStack_4a0.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              auVar16 = local_438;
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)LStack_430._0_8_;
              _local_438 = (undefined1  [16])0x0;
              auVar13 = _local_438;
              local_438[0] = auVar16[0];
              local_438[1] = auVar16[1];
              local_438._2_6_ = auVar16._2_6_;
              LStack_4a0.id_ = local_438[0];
              LStack_4a0.physical_type_ = local_438[1];
              LStack_4a0._2_6_ = local_438._2_6_;
              _local_438 = auVar13;
              if (peVar15 != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
                }
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(local_4a8 + 8));
              local_4a8 = *(undefined1 (*) [8])
                           &(pTVar27->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false>;
              *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
            }
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b62117;
                lVar48 = 0;
                uVar50 = 0;
                do {
                  uVar30 = uVar50;
                  if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                    uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                  }
                  if (local_4a8 == (undefined1  [8])0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = (*(byte *)local_4a8 & 1) == 0;
                  }
                  puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar63 = false;
                  }
                  else {
                    bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                  }
                  if ((bVar62 | bVar63) == 1) {
                    bVar62 = (bool)(bVar62 ^ bVar63);
                  }
                  else {
                    bVar62 = uhugeint_t::operator==(puVar38,puVar45);
                    bVar62 = !bVar62;
                  }
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                  lVar48 = lVar48 + (ulong)bVar62;
                  uVar50 = uVar50 + 1;
                  puVar45 = puVar45 + 1;
                } while (count != uVar50);
                goto LAB_00b6211a;
              }
              if (count != 0) {
                uVar50 = 0;
                local_4d0 = 0;
                do {
                  uVar30 = uVar50;
                  if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                    uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                  }
                  if (local_4a8 == (undefined1  [8])0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = (*(byte *)local_4a8 & 1) == 0;
                  }
                  puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar63 = false;
                  }
                  else {
                    bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                  }
                  if ((bVar62 | bVar63) == 1) {
                    bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                  }
                  else {
                    bVar62 = uhugeint_t::operator==(puVar38,puVar45);
                  }
                  (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
                  local_4d0 = local_4d0 + bVar62;
                  uVar50 = uVar50 + 1;
                  puVar45 = puVar45 + 1;
                  local_118.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          LStack_4a0.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
                } while (count != uVar50);
                goto LAB_00b62267;
              }
            }
            else if (count != 0) {
              lVar48 = 0;
              local_4d0 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(byte *)local_4a8 & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar38,puVar45);
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
                local_4d0 = local_4d0 + bVar62;
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
                uVar50 = uVar50 + 1;
                puVar45 = puVar45 + 1;
                local_118.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        LStack_4a0.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
              } while (count != uVar50);
              goto LAB_00b62267;
            }
            goto LAB_00b5e975;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*puVar2 & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*puVar3 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              if (bVar62 == bVar63) {
LAB_00b6051b:
                if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
                  psVar10 = (sel.ptr)->sel_vector;
                  psVar11 = (true_sel.ptr)->sel_vector;
                  iVar33 = 0;
                  do {
                    sVar46 = (sel_t)iVar33;
                    if (psVar10 != (sel_t *)0x0) {
                      sVar46 = psVar10[iVar33];
                    }
                    psVar11[iVar33] = sVar46;
                    iVar33 = iVar33 + 1;
                  } while (count != iVar33);
                  return count;
                }
                return count;
              }
            }
            else {
              bVar62 = uhugeint_t::operator==((uhugeint_t *)left->data,(uhugeint_t *)right->data);
              if (bVar62) goto LAB_00b6051b;
            }
            if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            iVar33 = 0;
            do {
              sVar46 = (sel_t)iVar33;
              if (psVar10 != (sel_t *)0x0) {
                sVar46 = psVar10[iVar33];
              }
              psVar11[iVar33] = sVar46;
              iVar33 = iVar33 + 1;
            } while (count != iVar33);
            return 0;
          }
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        uVar14 = LStack_4a0._0_8_;
        uVar17 = LStack_430._0_8_;
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count != 0) {
                psVar10 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar11 = *(sel_t **)local_438;
                lVar32 = 0;
                iVar33 = 0;
                do {
                  iVar49 = iVar33;
                  if (psVar10 != (sel_t *)0x0) {
                    iVar49 = (idx_t)psVar10[iVar33];
                  }
                  iVar52 = iVar33;
                  if (lVar48 != 0) {
                    iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
                  }
                  iVar47 = iVar33;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar47 = (idx_t)psVar11[iVar33];
                  }
                  bVar62 = uhugeint_t::operator==
                                     ((uhugeint_t *)(uVar14 + iVar52 * 0x10),
                                      (uhugeint_t *)(uVar17 + iVar47 * 0x10));
                  if (!bVar62) {
                    (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
                    lVar32 = lVar32 + 1;
                  }
                  iVar33 = iVar33 + 1;
                } while (count != iVar33);
                goto LAB_00b5fa00;
              }
              goto LAB_00b5f9fe;
            }
            if (count == 0) goto LAB_00b5a49f;
            psVar10 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_438;
            iVar33 = 0;
            local_4d0 = 0;
            do {
              iVar49 = iVar33;
              if (psVar10 != (sel_t *)0x0) {
                iVar49 = (idx_t)psVar10[iVar33];
              }
              iVar52 = iVar33;
              if (lVar48 != 0) {
                iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
              }
              iVar47 = iVar33;
              if (psVar11 != (sel_t *)0x0) {
                iVar47 = (idx_t)psVar11[iVar33];
              }
              bVar62 = uhugeint_t::operator==
                                 ((uhugeint_t *)(uVar14 + iVar52 * 0x10),
                                  (uhugeint_t *)(uVar17 + iVar47 * 0x10));
              if (bVar62) {
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
                local_4d0 = local_4d0 + 1;
              }
              iVar33 = iVar33 + 1;
            } while (count != iVar33);
          }
          else {
            if (count == 0) goto LAB_00b5a49f;
            psVar10 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_438;
            local_4d0 = 0;
            iVar49 = 0;
            iVar33 = 0;
            do {
              iVar52 = iVar49;
              if (psVar10 != (sel_t *)0x0) {
                iVar52 = (idx_t)psVar10[iVar49];
              }
              iVar47 = iVar49;
              if (lVar48 != 0) {
                iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
              }
              iVar57 = iVar49;
              if (psVar11 != (sel_t *)0x0) {
                iVar57 = (idx_t)psVar11[iVar49];
              }
              bVar62 = uhugeint_t::operator==
                                 ((uhugeint_t *)(uVar14 + iVar47 * 0x10),
                                  (uhugeint_t *)(uVar17 + iVar57 * 0x10));
              if (bVar62) {
                iVar47 = local_4d0;
                oVar29.ptr = true_sel.ptr;
                iVar57 = iVar33;
                local_4d0 = local_4d0 + 1;
              }
              else {
                iVar57 = iVar33 + 1;
                iVar47 = iVar33;
                oVar29.ptr = false_sel.ptr;
              }
              (oVar29.ptr)->sel_vector[iVar47] = (sel_t)iVar52;
              iVar49 = iVar49 + 1;
              iVar33 = iVar57;
            } while (count != iVar49);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b5f9fe;
            psVar10 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_438;
            lVar32 = 0;
            iVar33 = 0;
            do {
              iVar49 = iVar33;
              if (psVar10 != (sel_t *)0x0) {
                iVar49 = (idx_t)psVar10[iVar33];
              }
              iVar52 = iVar33;
              if (lVar48 != 0) {
                iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
              }
              iVar47 = iVar33;
              if (psVar11 != (sel_t *)0x0) {
                iVar47 = (idx_t)psVar11[iVar33];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) &
                         1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                if (bVar62 != bVar63) {
LAB_00b5f9c2:
                  (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
                  lVar32 = lVar32 + 1;
                }
              }
              else {
                bVar62 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar14 + iVar52 * 0x10),
                                    (uhugeint_t *)(uVar17 + iVar47 * 0x10));
                if (!bVar62) goto LAB_00b5f9c2;
              }
              iVar33 = iVar33 + 1;
            } while (count != iVar33);
            goto LAB_00b5fa00;
          }
          if (count == 0) goto LAB_00b5a49f;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          iVar33 = 0;
          local_4d0 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              if (bVar62 == bVar63) {
LAB_00b5a45a:
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
                local_4d0 = local_4d0 + 1;
              }
            }
            else {
              bVar62 = uhugeint_t::operator==
                                 ((uhugeint_t *)(uVar14 + iVar52 * 0x10),
                                  (uhugeint_t *)(uVar17 + iVar47 * 0x10));
              if (bVar62) goto LAB_00b5a45a;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
        }
        else {
          if (count == 0) goto LAB_00b5a49f;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          iVar33 = 0;
          local_4d0 = 0;
          iVar49 = 0;
          do {
            iVar52 = iVar49;
            if (psVar10 != (sel_t *)0x0) {
              iVar52 = (idx_t)psVar10[iVar49];
            }
            iVar47 = iVar49;
            if (lVar48 != 0) {
              iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
            }
            iVar57 = iVar49;
            if (psVar11 != (sel_t *)0x0) {
              iVar57 = (idx_t)psVar11[iVar49];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar47 >> 6) * 8) >> (iVar47 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar57 >> 6] >> (iVar57 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              if (bVar62 == bVar63) goto LAB_00b58137;
LAB_00b5810f:
              iVar47 = iVar33;
              oVar29.ptr = false_sel.ptr;
              iVar33 = iVar33 + 1;
            }
            else {
              bVar62 = uhugeint_t::operator==
                                 ((uhugeint_t *)(uVar14 + iVar47 * 0x10),
                                  (uhugeint_t *)(uVar17 + iVar57 * 0x10));
              if (!bVar62) goto LAB_00b5810f;
LAB_00b58137:
              iVar47 = local_4d0;
              oVar29.ptr = true_sel.ptr;
              local_4d0 = local_4d0 + 1;
            }
            (oVar29.ptr)->sel_vector[iVar47] = (sel_t)iVar52;
            iVar49 = iVar49 + 1;
          } while (count != iVar49);
        }
        goto LAB_00b5fa0d;
      }
      if (PVar1 != INT128) goto switchD_00b53525_caseD_a;
      local_298 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          pdVar7 = left->data;
          pdVar9 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return 0;
            }
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            psVar8 = (false_sel.ptr)->sel_vector;
            lVar48 = 8;
            lVar32 = 0;
            iVar33 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar7 + lVar48) != *(long *)(pdVar9 + lVar48) ||
                         *(long *)(pdVar7 + lVar48 + -8) != *(long *)(pdVar9 + lVar48 + -8);
              }
              psVar11[iVar33] = (sel_t)uVar30;
              iVar33 = iVar33 + (bVar62 ^ 1);
              psVar8[lVar32] = (sel_t)uVar30;
              lVar32 = lVar32 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              lVar48 = lVar48 + 0x10;
            } while (count != uVar50);
            return iVar33;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return 0;
            }
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            lVar48 = 8;
            uVar50 = 0;
            iVar33 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar7 + lVar48) != *(long *)(pdVar9 + lVar48) ||
                         *(long *)(pdVar7 + lVar48 + -8) != *(long *)(pdVar9 + lVar48 + -8);
              }
              psVar11[iVar33] = (sel_t)uVar30;
              iVar33 = iVar33 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
              lVar48 = lVar48 + 0x10;
            } while (count != uVar50);
            return iVar33;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar32 = 8;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar7 + lVar32) != *(long *)(pdVar9 + lVar32) ||
                         *(long *)(pdVar7 + lVar32 + -8) != *(long *)(pdVar9 + lVar32 + -8);
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              lVar32 = lVar32 + 0x10;
            } while (count != uVar50);
            goto LAB_00b61111;
          }
          goto LAB_00b6110f;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          plVar40 = (long *)right->data;
          puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar7 = left->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_318._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_438,(unsigned_long *)&local_318);
            peVar15 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar16 = local_438;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_430._0_8_;
            _local_438 = (undefined1  [16])0x0;
            auVar13 = _local_438;
            local_438[0] = auVar16[0];
            local_438[1] = auVar16[1];
            local_438._2_6_ = auVar16._2_6_;
            LStack_4a0.id_ = local_438[0];
            LStack_4a0.physical_type_ = local_438[1];
            LStack_4a0._2_6_ = local_438._2_6_;
            _local_438 = auVar13;
            if (peVar15 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
              }
            }
            pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            local_4a8 = *(undefined1 (*) [8])
                         &(pTVar27->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b62258;
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (false_sel.ptr)->sel_vector;
              plVar41 = (long *)(pdVar7 + 8);
              lVar48 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if (psVar10 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar10[uVar50];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = *plVar41 != plVar40[1] || plVar41[-1] != *plVar40;
                }
                psVar11[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)bVar62;
                uVar50 = uVar50 + 1;
                plVar41 = plVar41 + 2;
              } while (count != uVar50);
              goto LAB_00b6225a;
            }
            if (count != 0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              plVar41 = (long *)(pdVar7 + 8);
              uVar50 = 0;
              local_4d0 = 0;
              do {
                uVar30 = uVar50;
                if (psVar10 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar10[uVar50];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = *plVar41 != plVar40[1] || plVar41[-1] != *plVar40;
                }
                psVar11[local_4d0] = (sel_t)uVar30;
                local_4d0 = local_4d0 + (bVar62 ^ 1);
                uVar50 = uVar50 + 1;
                plVar41 = plVar41 + 2;
              } while (count != uVar50);
              goto LAB_00b62267;
            }
          }
          else if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            psVar8 = (false_sel.ptr)->sel_vector;
            plVar41 = (long *)(pdVar7 + 8);
            lVar48 = 0;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *plVar41 != plVar40[1] || plVar41[-1] != *plVar40;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              psVar8[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              plVar41 = plVar41 + 2;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
          goto LAB_00b5e975;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          plVar40 = (long *)left->data;
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar7 = right->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_318._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_438,(unsigned_long *)&local_318);
            peVar15 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar16 = local_438;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_430._0_8_;
            _local_438 = (undefined1  [16])0x0;
            auVar13 = _local_438;
            local_438[0] = auVar16[0];
            local_438[1] = auVar16[1];
            local_438._2_6_ = auVar16._2_6_;
            LStack_4a0.id_ = local_438[0];
            LStack_4a0.physical_type_ = local_438[1];
            LStack_4a0._2_6_ = local_438._2_6_;
            _local_438 = auVar13;
            if (peVar15 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
              }
            }
            pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            local_4a8 = *(undefined1 (*) [8])
                         &(pTVar27->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b62258;
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (false_sel.ptr)->sel_vector;
              plVar41 = (long *)(pdVar7 + 8);
              lVar48 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if (psVar10 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar10[uVar50];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = plVar40[1] != *plVar41 || *plVar40 != plVar41[-1];
                }
                psVar11[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)bVar62;
                uVar50 = uVar50 + 1;
                plVar41 = plVar41 + 2;
              } while (count != uVar50);
              goto LAB_00b6225a;
            }
            if (count != 0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              plVar41 = (long *)(pdVar7 + 8);
              uVar50 = 0;
              local_4d0 = 0;
              do {
                uVar30 = uVar50;
                if (psVar10 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar10[uVar50];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = plVar40[1] != *plVar41 || *plVar40 != plVar41[-1];
                }
                psVar11[local_4d0] = (sel_t)uVar30;
                local_4d0 = local_4d0 + (bVar62 ^ 1);
                uVar50 = uVar50 + 1;
                plVar41 = plVar41 + 2;
              } while (count != uVar50);
              goto LAB_00b62267;
            }
          }
          else if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            psVar8 = (false_sel.ptr)->sel_vector;
            plVar41 = (long *)(pdVar7 + 8);
            lVar48 = 0;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = plVar40[1] != *plVar41 || *plVar40 != plVar41[-1];
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              psVar8[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              plVar41 = plVar41 + 2;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
          goto LAB_00b5e975;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*puVar2 & 1) == 0;
          }
          if (puVar3 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*puVar3 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 == bVar63) {
LAB_00b605ef:
              if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
                psVar10 = (sel.ptr)->sel_vector;
                psVar11 = (true_sel.ptr)->sel_vector;
                iVar33 = 0;
                do {
                  sVar46 = (sel_t)iVar33;
                  if (psVar10 != (sel_t *)0x0) {
                    sVar46 = psVar10[iVar33];
                  }
                  psVar11[iVar33] = sVar46;
                  iVar33 = iVar33 + 1;
                } while (count != iVar33);
                return count;
              }
              return count;
            }
          }
          else if ((*(long *)left->data == *(long *)right->data) &&
                  (*(long *)((long)left->data + 8) == *(long *)((long)right->data + 8)))
          goto LAB_00b605ef;
          if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar33 = 0;
          do {
            sVar46 = (sel_t)iVar33;
            if (psVar10 != (sel_t *)0x0) {
              sVar46 = psVar10[iVar33];
            }
            psVar11[iVar33] = sVar46;
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          return 0;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
      if (LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_430.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b5faaa;
            psVar10 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_438;
            lVar32 = 0;
            iVar33 = 0;
            do {
              iVar49 = iVar33;
              if (psVar10 != (sel_t *)0x0) {
                iVar49 = (idx_t)psVar10[iVar33];
              }
              iVar52 = iVar33;
              if (lVar48 != 0) {
                iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
              }
              iVar47 = iVar33;
              if (psVar11 != (sel_t *)0x0) {
                iVar47 = (idx_t)psVar11[iVar33];
              }
              if ((*(long *)(LStack_4a0._0_8_ + iVar52 * 0x10) !=
                   *(long *)(LStack_430._0_8_ + iVar47 * 0x10)) ||
                 (*(long *)(LStack_4a0._0_8_ + (iVar52 * 2 + 1) * 8) !=
                  *(long *)(LStack_430._0_8_ + iVar47 * 0x10 + 8))) {
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
                lVar32 = lVar32 + 1;
              }
              iVar33 = iVar33 + 1;
            } while (count != iVar33);
            goto LAB_00b5faac;
          }
          if (count == 0) goto LAB_00b5a606;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          iVar33 = 0;
          local_4d0 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if ((*(long *)(LStack_4a0._0_8_ + iVar52 * 0x10) ==
                 *(long *)(LStack_430._0_8_ + iVar47 * 0x10)) &&
               (*(long *)(LStack_4a0._0_8_ + (iVar52 * 2 + 1) * 8) ==
                *(long *)(LStack_430._0_8_ + iVar47 * 0x10 + 8))) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
              local_4d0 = local_4d0 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
        }
        else {
          if (count == 0) goto LAB_00b5a606;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          local_4d0 = 0;
          iVar49 = 0;
          iVar33 = 0;
          do {
            iVar52 = iVar49;
            if (psVar10 != (sel_t *)0x0) {
              iVar52 = (idx_t)psVar10[iVar49];
            }
            iVar47 = iVar49;
            if (lVar48 != 0) {
              iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
            }
            iVar57 = iVar49;
            if (psVar11 != (sel_t *)0x0) {
              iVar57 = (idx_t)psVar11[iVar49];
            }
            if ((*(long *)(LStack_4a0._0_8_ + iVar47 * 0x10) ==
                 *(long *)(LStack_430._0_8_ + iVar57 * 0x10)) &&
               (*(long *)(LStack_4a0._0_8_ + (iVar47 * 2 + 1) * 8) ==
                *(long *)(LStack_430._0_8_ + iVar57 * 0x10 + 8))) {
              oVar29.ptr = true_sel.ptr;
              iVar47 = iVar33;
              iVar33 = local_4d0;
              local_4d0 = local_4d0 + 1;
            }
            else {
              iVar47 = iVar33 + 1;
              oVar29.ptr = false_sel.ptr;
            }
            (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
            iVar49 = iVar49 + 1;
            iVar33 = iVar47;
          } while (count != iVar49);
        }
      }
      else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5fb84;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              if (bVar62 != bVar63) {
LAB_00b5fb6a:
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
                lVar32 = lVar32 + 1;
              }
            }
            else if ((*(long *)(LStack_4a0._0_8_ + iVar52 * 0x10) !=
                      *(long *)(LStack_430._0_8_ + iVar47 * 0x10)) ||
                    (((long *)(LStack_4a0._0_8_ + iVar52 * 0x10))[1] !=
                     ((long *)(LStack_430._0_8_ + iVar47 * 0x10))[1])) goto LAB_00b5fb6a;
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5fb86;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        iVar33 = 0;
        local_4d0 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 == bVar63) {
LAB_00b5a5e9:
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
              local_4d0 = local_4d0 + 1;
            }
          }
          else if ((*(long *)(LStack_4a0._0_8_ + iVar52 * 0x10) ==
                    *(long *)(LStack_430._0_8_ + iVar47 * 0x10)) &&
                  (((long *)(LStack_4a0._0_8_ + iVar52 * 0x10))[1] ==
                   ((long *)(LStack_430._0_8_ + iVar47 * 0x10))[1])) goto LAB_00b5a5e9;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
      else {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        iVar52 = 0;
        iVar33 = 0;
        iVar49 = 0;
        do {
          iVar47 = iVar52;
          if (psVar10 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar10[iVar52];
          }
          iVar57 = iVar52;
          if (lVar48 != 0) {
            iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
          }
          iVar61 = iVar52;
          if (psVar11 != (sel_t *)0x0) {
            iVar61 = (idx_t)psVar11[iVar52];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 == bVar63) goto LAB_00b58233;
LAB_00b58240:
            iVar57 = iVar33 + 1;
            local_4d0 = iVar49;
            iVar49 = iVar33;
            oVar29.ptr = false_sel.ptr;
          }
          else {
            if ((*(long *)(LStack_4a0._0_8_ + iVar57 * 0x10) !=
                 *(long *)(LStack_430._0_8_ + iVar61 * 0x10)) ||
               (((long *)(LStack_4a0._0_8_ + iVar57 * 0x10))[1] !=
                ((long *)(LStack_430._0_8_ + iVar61 * 0x10))[1])) goto LAB_00b58240;
LAB_00b58233:
            local_4d0 = iVar49 + 1;
            iVar57 = iVar33;
            oVar29.ptr = true_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar49] = (sel_t)iVar47;
          iVar52 = iVar52 + 1;
          iVar33 = iVar57;
          iVar49 = local_4d0;
        } while (count != iVar52);
      }
      goto LAB_00b5fb8e;
    }
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar37 = (string_t *)left->data;
        psVar44 = (string_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar37,psVar44);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            psVar37 = psVar37 + 1;
            psVar44 = psVar44 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar50 = 0;
          iVar33 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar37,psVar44);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            uVar50 = uVar50 + 1;
            psVar37 = psVar37 + 1;
            psVar44 = psVar44 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = string_t::operator==(psVar37,psVar44);
              bVar62 = !bVar62;
            }
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
            psVar37 = psVar37 + 1;
            psVar44 = psVar44 + 1;
          } while (count != uVar50);
          goto LAB_00b61051;
        }
        goto LAB_00b6104e;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar37 = (string_t *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar44 = (string_t *)left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b61f1b;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = string_t::operator==(psVar44,psVar37);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              psVar44 = psVar44 + 1;
            } while (count != uVar50);
            goto LAB_00b61f1e;
          }
          if (count != 0) {
            uVar50 = 0;
            iVar33 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = string_t::operator==(psVar44,psVar37);
              }
              (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
              iVar33 = iVar33 + bVar62;
              uVar50 = uVar50 + 1;
              psVar44 = psVar44 + 1;
            } while (count != uVar50);
            goto LAB_00b61f29;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar44,psVar37);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            psVar44 = psVar44 + 1;
          } while (count != uVar50);
          goto LAB_00b61f29;
        }
        goto LAB_00b5e62e;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar37 = (string_t *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar44 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62117;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = string_t::operator==(psVar37,psVar44);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              psVar44 = psVar44 + 1;
            } while (count != uVar50);
            goto LAB_00b6211a;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = string_t::operator==(psVar37,psVar44);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + bVar62;
              uVar50 = uVar50 + 1;
              psVar44 = psVar44 + 1;
              local_118.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar37,psVar44);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            psVar44 = psVar44 + 1;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b60468:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else {
          bVar62 = string_t::operator==((string_t *)left->data,(string_t *)right->data);
          if (bVar62) goto LAB_00b60468;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    uVar14 = LStack_4a0._0_8_;
    uVar17 = LStack_430._0_8_;
    if (LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_438;
            lVar32 = 0;
            iVar33 = 0;
            do {
              iVar49 = iVar33;
              if (psVar10 != (sel_t *)0x0) {
                iVar49 = (idx_t)psVar10[iVar33];
              }
              iVar52 = iVar33;
              if (lVar48 != 0) {
                iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
              }
              iVar47 = iVar33;
              if (psVar11 != (sel_t *)0x0) {
                iVar47 = (idx_t)psVar11[iVar33];
              }
              bVar62 = string_t::operator==
                                 ((string_t *)(uVar14 + iVar52 * 0x10),
                                  (string_t *)(uVar17 + iVar47 * 0x10));
              if (!bVar62) {
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
                lVar32 = lVar32 + 1;
              }
              iVar33 = iVar33 + 1;
            } while (count != iVar33);
            goto LAB_00b5fa00;
          }
          goto LAB_00b5f9fe;
        }
        if (count == 0) goto LAB_00b5a49f;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        iVar33 = 0;
        local_4d0 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          bVar62 = string_t::operator==
                             ((string_t *)(uVar14 + iVar52 * 0x10),
                              (string_t *)(uVar17 + iVar47 * 0x10));
          if (bVar62) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
      else {
        if (count == 0) goto LAB_00b5a49f;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          bVar62 = string_t::operator==
                             ((string_t *)(uVar14 + iVar47 * 0x10),
                              (string_t *)(uVar17 + iVar57 * 0x10));
          if (bVar62) {
            iVar47 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            iVar57 = iVar33;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar57 = iVar33 + 1;
            iVar47 = iVar33;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar47] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar57;
        } while (count != iVar49);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5f9fe;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5f87f:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            bVar62 = string_t::operator==
                               ((string_t *)(uVar14 + iVar52 * 0x10),
                                (string_t *)(uVar17 + iVar47 * 0x10));
            if (!bVar62) goto LAB_00b5f87f;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        goto LAB_00b5fa00;
      }
      if (count == 0) goto LAB_00b5a49f;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5a2e4:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          bVar62 = string_t::operator==
                             ((string_t *)(uVar14 + iVar52 * 0x10),
                              (string_t *)(uVar17 + iVar47 * 0x10));
          if (bVar62) goto LAB_00b5a2e4;
        }
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    else {
      if (count == 0) goto LAB_00b5a49f;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      iVar49 = 0;
      do {
        iVar52 = iVar49;
        if (psVar10 != (sel_t *)0x0) {
          iVar52 = (idx_t)psVar10[iVar49];
        }
        iVar47 = iVar49;
        if (lVar48 != 0) {
          iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
        }
        iVar57 = iVar49;
        if (psVar11 != (sel_t *)0x0) {
          iVar57 = (idx_t)psVar11[iVar49];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar47 >> 6) * 8) >> (iVar47 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar57 >> 6] >> (iVar57 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) goto LAB_00b5803b;
LAB_00b58013:
          iVar47 = iVar33;
          oVar29.ptr = false_sel.ptr;
          iVar33 = iVar33 + 1;
        }
        else {
          bVar62 = string_t::operator==
                             ((string_t *)(uVar14 + iVar47 * 0x10),
                              (string_t *)(uVar17 + iVar57 * 0x10));
          if (!bVar62) goto LAB_00b58013;
LAB_00b5803b:
          iVar47 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar29.ptr)->sel_vector[iVar47] = (sel_t)iVar52;
        iVar49 = iVar49 + 1;
      } while (count != iVar49);
    }
    goto LAB_00b5fa0d;
  }
  switch(PVar1) {
  case BOOL:
  case INT8:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          iVar33 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar7[uVar50] != pdVar9[uVar50];
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar7[uVar50] != pdVar9[uVar50];
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar7[uVar50] != pdVar9[uVar50];
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
LAB_00b6110f:
        lVar48 = 0;
LAB_00b61111:
        return count - lVar48;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar9[uVar50] != *pdVar7;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar9[uVar50] != *pdVar7;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar9[uVar50] != *pdVar7;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b62258:
              lVar48 = 0;
            }
            else {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (false_sel.ptr)->sel_vector;
              lVar48 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if (psVar10 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar10[uVar50];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = *pdVar5 != pdVar7[uVar50];
                }
                psVar11[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)bVar62;
                uVar50 = uVar50 + 1;
              } while (count != uVar50);
            }
LAB_00b6225a:
            local_4d0 = count - lVar48;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b62267;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *pdVar5 != pdVar7[uVar50];
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *pdVar5 != pdVar7[uVar50];
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5cc34:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*left->data == *right->data) goto LAB_00b5cc34;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5faaa;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) != *(data_t *)(LStack_430._0_8_ + iVar47))
            {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
LAB_00b5faac:
          local_4d0 = count - lVar32;
        }
        else {
          if (count == 0) goto LAB_00b5a606;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          local_4d0 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) == *(data_t *)(LStack_430._0_8_ + iVar47))
            {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
              local_4d0 = local_4d0 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
        }
      }
      else if (count == 0) {
LAB_00b5a606:
        local_4d0 = 0;
      }
      else {
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar47) == *(data_t *)(LStack_430._0_8_ + iVar57)) {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5fb84;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5cbf4:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) !=
                   *(data_t *)(LStack_430._0_8_ + iVar47)) goto LAB_00b5cbf4;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
LAB_00b5fb86:
        local_4d0 = count - lVar32;
      }
      else {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 == bVar63) {
LAB_00b57d90:
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
              local_4d0 = local_4d0 + 1;
            }
          }
          else if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) ==
                   *(data_t *)(LStack_430._0_8_ + iVar47)) goto LAB_00b57d90;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
    }
    else {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar57) ==
                   *(data_t *)(LStack_430._0_8_ + iVar61);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    break;
  case UINT8:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          iVar33 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar7[uVar50] != pdVar9[uVar50];
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar7[uVar50] != pdVar9[uVar50];
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar7[uVar50] != pdVar9[uVar50];
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
        goto LAB_00b6110f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar9[uVar50] != *pdVar7;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar9[uVar50] != *pdVar7;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar9[uVar50] != *pdVar7;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *pdVar5 != pdVar7[uVar50];
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *pdVar5 != pdVar7[uVar50];
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *pdVar5 != pdVar7[uVar50];
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b6026c:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*left->data == *right->data) goto LAB_00b6026c;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar47) == *(data_t *)(LStack_430._0_8_ + iVar57)) {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5faaa;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) != *(data_t *)(LStack_430._0_8_ + iVar47))
            {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5faac;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        iVar33 = 0;
        local_4d0 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) == *(data_t *)(LStack_430._0_8_ + iVar47)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
    }
    else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar57) ==
                   *(data_t *)(LStack_430._0_8_ + iVar61);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    else {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5fb84;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5f637:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) !=
                   *(data_t *)(LStack_430._0_8_ + iVar47)) goto LAB_00b5f637;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        goto LAB_00b5fb86;
      }
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5a060:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar52) == *(data_t *)(LStack_430._0_8_ + iVar47))
        goto LAB_00b5a060;
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    break;
  case UINT16:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *(short *)(pdVar9 + uVar50 * 2);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          uVar50 = 0;
          iVar33 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *(short *)(pdVar9 + uVar50 * 2);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *(short *)(pdVar9 + uVar50 * 2);
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
        goto LAB_00b6110f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar6 = (short *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *psVar6;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *psVar6;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *psVar6;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar6 = (short *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *psVar6 != *(short *)(pdVar7 + uVar50 * 2);
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *psVar6 != *(short *)(pdVar7 + uVar50 * 2);
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *psVar6 != *(short *)(pdVar7 + uVar50 * 2);
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b60108:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data == *(short *)right->data) goto LAB_00b60108;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5faaa;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) !=
                *(short *)(LStack_430._0_8_ + iVar47 * 2)) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5faac;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        iVar33 = 0;
        local_4d0 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) == *(short *)(LStack_430._0_8_ + iVar47 * 2)
             ) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
      else {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(short *)(LStack_4a0._0_8_ + iVar47 * 2) == *(short *)(LStack_430._0_8_ + iVar57 * 2)
             ) {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5fb84;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5f3f3:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) !=
                   *(short *)(LStack_430._0_8_ + iVar47 * 2)) goto LAB_00b5f3f3;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        goto LAB_00b5fb86;
      }
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b59df4:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) ==
                 *(short *)(LStack_430._0_8_ + iVar47 * 2)) goto LAB_00b59df4;
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    else {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(short *)(LStack_4a0._0_8_ + iVar57 * 2) ==
                   *(short *)(LStack_430._0_8_ + iVar61 * 2);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    break;
  case INT16:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          iVar33 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *(short *)(pdVar9 + uVar50 * 2);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *(short *)(pdVar9 + uVar50 * 2);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *(short *)(pdVar9 + uVar50 * 2);
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
        goto LAB_00b6110f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar6 = (short *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *psVar6;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *psVar6;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar7 + uVar50 * 2) != *psVar6;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar6 = (short *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *psVar6 != *(short *)(pdVar7 + uVar50 * 2);
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *psVar6 != *(short *)(pdVar7 + uVar50 * 2);
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *psVar6 != *(short *)(pdVar7 + uVar50 * 2);
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b60056:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data == *(short *)right->data) goto LAB_00b60056;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5faaa;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) !=
                *(short *)(LStack_430._0_8_ + iVar47 * 2)) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5faac;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) == *(short *)(LStack_430._0_8_ + iVar47 * 2)
             ) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
      else {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(short *)(LStack_4a0._0_8_ + iVar47 * 2) == *(short *)(LStack_430._0_8_ + iVar57 * 2)
             ) {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5fb84;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5f2cd:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) !=
                   *(short *)(LStack_430._0_8_ + iVar47 * 2)) goto LAB_00b5f2cd;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        goto LAB_00b5fb86;
      }
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      local_4d0 = 0;
      iVar33 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b59cba:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else if (*(short *)(LStack_4a0._0_8_ + iVar52 * 2) ==
                 *(short *)(LStack_430._0_8_ + iVar47 * 2)) goto LAB_00b59cba;
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    else {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(short *)(LStack_4a0._0_8_ + iVar57 * 2) ==
                   *(short *)(LStack_430._0_8_ + iVar61 * 2);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    break;
  case UINT32:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *(int *)(pdVar9 + uVar50 * 4);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          uVar50 = 0;
          iVar33 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *(int *)(pdVar9 + uVar50 * 4);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *(int *)(pdVar9 + uVar50 * 4);
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
        goto LAB_00b6110f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar22 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *piVar22;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *piVar22;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *piVar22;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar22 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *piVar22 != *(int *)(pdVar7 + uVar50 * 4);
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *piVar22 != *(int *)(pdVar7 + uVar50 * 4);
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *piVar22 != *(int *)(pdVar7 + uVar50 * 4);
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5ffa6:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data == *(int *)right->data) goto LAB_00b5ffa6;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5faaa;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) != *(int *)(LStack_430._0_8_ + iVar47 * 4))
            {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5faac;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        iVar33 = 0;
        local_4d0 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) == *(int *)(LStack_430._0_8_ + iVar47 * 4)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
      else {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(int *)(LStack_4a0._0_8_ + iVar47 * 4) == *(int *)(LStack_430._0_8_ + iVar57 * 4)) {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5fb84;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5f1a7:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) !=
                   *(int *)(LStack_430._0_8_ + iVar47 * 4)) goto LAB_00b5f1a7;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        goto LAB_00b5fb86;
      }
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b59b80:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) == *(int *)(LStack_430._0_8_ + iVar47 * 4))
        goto LAB_00b59b80;
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    else {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(int *)(LStack_4a0._0_8_ + iVar57 * 4) ==
                   *(int *)(LStack_430._0_8_ + iVar61 * 4);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    break;
  case INT32:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          iVar33 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *(int *)(pdVar9 + uVar50 * 4);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *(int *)(pdVar9 + uVar50 * 4);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *(int *)(pdVar9 + uVar50 * 4);
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
        goto LAB_00b6110f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar22 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *piVar22;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *piVar22;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar7 + uVar50 * 4) != *piVar22;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar22 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *piVar22 != *(int *)(pdVar7 + uVar50 * 4);
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *piVar22 != *(int *)(pdVar7 + uVar50 * 4);
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *piVar22 != *(int *)(pdVar7 + uVar50 * 4);
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5fef6:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data == *(int *)right->data) goto LAB_00b5fef6;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5faaa;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) != *(int *)(LStack_430._0_8_ + iVar47 * 4))
            {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5faac;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) == *(int *)(LStack_430._0_8_ + iVar47 * 4)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
      else {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(int *)(LStack_4a0._0_8_ + iVar47 * 4) == *(int *)(LStack_430._0_8_ + iVar57 * 4)) {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5fb84;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5f085:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) !=
                   *(int *)(LStack_430._0_8_ + iVar47 * 4)) goto LAB_00b5f085;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        goto LAB_00b5fb86;
      }
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      local_4d0 = 0;
      iVar33 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b59a4a:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else if (*(int *)(LStack_4a0._0_8_ + iVar52 * 4) == *(int *)(LStack_430._0_8_ + iVar47 * 4))
        goto LAB_00b59a4a;
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    else {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(int *)(LStack_4a0._0_8_ + iVar57 * 4) ==
                   *(int *)(LStack_430._0_8_ + iVar61 * 4);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    break;
  case UINT64:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *(long *)(pdVar9 + uVar50 * 8);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          uVar50 = 0;
          iVar33 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *(long *)(pdVar9 + uVar50 * 8);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *(long *)(pdVar9 + uVar50 * 8);
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
        goto LAB_00b6110f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        plVar40 = (long *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *plVar40;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *plVar40;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *plVar40;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar40 = (long *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *plVar40 != *(long *)(pdVar7 + uVar50 * 8);
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *plVar40 != *(long *)(pdVar7 + uVar50 * 8);
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *plVar40 != *(long *)(pdVar7 + uVar50 * 8);
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b603b6:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data == *(long *)right->data) goto LAB_00b603b6;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(long *)(LStack_4a0._0_8_ + iVar47 * 8) == *(long *)(LStack_430._0_8_ + iVar57 * 8))
          {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_438;
            lVar32 = 0;
            iVar33 = 0;
            do {
              iVar49 = iVar33;
              if (psVar10 != (sel_t *)0x0) {
                iVar49 = (idx_t)psVar10[iVar33];
              }
              iVar52 = iVar33;
              if (lVar48 != 0) {
                iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
              }
              iVar47 = iVar33;
              if (psVar11 != (sel_t *)0x0) {
                iVar47 = (idx_t)psVar11[iVar33];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) !=
                  *(long *)(LStack_430._0_8_ + iVar47 * 8)) {
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
                lVar32 = lVar32 + 1;
              }
              iVar33 = iVar33 + 1;
            } while (count != iVar33);
            goto LAB_00b5faac;
          }
LAB_00b5faaa:
          lVar32 = 0;
          goto LAB_00b5faac;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        iVar33 = 0;
        local_4d0 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) == *(long *)(LStack_430._0_8_ + iVar47 * 8))
          {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
    }
    else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(long *)(LStack_4a0._0_8_ + iVar57 * 8) ==
                   *(long *)(LStack_430._0_8_ + iVar61 * 8);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    else {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              if (bVar62 != bVar63) {
LAB_00b5f759:
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
                lVar32 = lVar32 + 1;
              }
            }
            else if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) !=
                     *(long *)(LStack_430._0_8_ + iVar47 * 8)) goto LAB_00b5f759;
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5fb86;
        }
LAB_00b5fb84:
        lVar32 = 0;
        goto LAB_00b5fb86;
      }
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5a196:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) ==
                 *(long *)(LStack_430._0_8_ + iVar47 * 8)) goto LAB_00b5a196;
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    break;
  case INT64:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          iVar33 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *(long *)(pdVar9 + uVar50 * 8);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *(long *)(pdVar9 + uVar50 * 8);
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *(long *)(pdVar9 + uVar50 * 8);
            }
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b61111;
        }
        goto LAB_00b6110f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        plVar40 = (long *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *plVar40;
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *plVar40;
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar7 + uVar50 * 8) != *plVar40;
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar40 = (long *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62258;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *plVar40 != *(long *)(pdVar7 + uVar50 * 8);
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b6225a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *plVar40 != *(long *)(pdVar7 + uVar50 * 8);
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *plVar40 != *(long *)(pdVar7 + uVar50 * 8);
            }
            psVar11[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b601ba:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data == *(long *)right->data) goto LAB_00b601ba;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5faaa;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          iVar33 = 0;
          do {
            iVar49 = iVar33;
            if (psVar10 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar10[iVar33];
            }
            iVar52 = iVar33;
            if (lVar48 != 0) {
              iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
            }
            iVar47 = iVar33;
            if (psVar11 != (sel_t *)0x0) {
              iVar47 = (idx_t)psVar11[iVar33];
            }
            if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) != *(long *)(LStack_430._0_8_ + iVar47 * 8)
               ) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          goto LAB_00b5faac;
        }
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) == *(long *)(LStack_430._0_8_ + iVar47 * 8))
          {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
      }
      else {
        if (count == 0) goto LAB_00b5a606;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        iVar49 = 0;
        iVar33 = 0;
        do {
          iVar52 = iVar49;
          if (psVar10 != (sel_t *)0x0) {
            iVar52 = (idx_t)psVar10[iVar49];
          }
          iVar47 = iVar49;
          if (lVar48 != 0) {
            iVar47 = (idx_t)*(uint *)(lVar48 + iVar49 * 4);
          }
          iVar57 = iVar49;
          if (psVar11 != (sel_t *)0x0) {
            iVar57 = (idx_t)psVar11[iVar49];
          }
          if (*(long *)(LStack_4a0._0_8_ + iVar47 * 8) == *(long *)(LStack_430._0_8_ + iVar57 * 8))
          {
            oVar29.ptr = true_sel.ptr;
            iVar47 = iVar33;
            iVar33 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar47 = iVar33 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar52;
          iVar49 = iVar49 + 1;
          iVar33 = iVar47;
        } while (count != iVar49);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5fb84;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        iVar33 = 0;
        do {
          iVar49 = iVar33;
          if (psVar10 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar10[iVar33];
          }
          iVar52 = iVar33;
          if (lVar48 != 0) {
            iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
          }
          iVar47 = iVar33;
          if (psVar11 != (sel_t *)0x0) {
            iVar47 = (idx_t)psVar11[iVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5f515:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar49;
              lVar32 = lVar32 + 1;
            }
          }
          else if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) !=
                   *(long *)(LStack_430._0_8_ + iVar47 * 8)) goto LAB_00b5f515;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        goto LAB_00b5fb86;
      }
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      local_4d0 = 0;
      iVar33 = 0;
      do {
        iVar49 = iVar33;
        if (psVar10 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar10[iVar33];
        }
        iVar52 = iVar33;
        if (lVar48 != 0) {
          iVar52 = (idx_t)*(uint *)(lVar48 + iVar33 * 4);
        }
        iVar47 = iVar33;
        if (psVar11 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar11[iVar33];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar52 >> 6) * 8) >> (iVar52 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar47 >> 6] >> (iVar47 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b59f2a:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar49;
            local_4d0 = local_4d0 + 1;
          }
        }
        else if (*(long *)(LStack_4a0._0_8_ + iVar52 * 8) ==
                 *(long *)(LStack_430._0_8_ + iVar47 * 8)) goto LAB_00b59f2a;
        iVar33 = iVar33 + 1;
      } while (count != iVar33);
    }
    else {
      if (count == 0) goto LAB_00b5a606;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar52 = 0;
      iVar33 = 0;
      iVar49 = 0;
      do {
        iVar47 = iVar52;
        if (psVar10 != (sel_t *)0x0) {
          iVar47 = (idx_t)psVar10[iVar52];
        }
        iVar57 = iVar52;
        if (lVar48 != 0) {
          iVar57 = (idx_t)*(uint *)(lVar48 + iVar52 * 4);
        }
        iVar61 = iVar52;
        if (psVar11 != (sel_t *)0x0) {
          iVar61 = (idx_t)psVar11[iVar52];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar57 >> 6) * 8) >> (iVar57 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar61 >> 6] >> (iVar61 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = bVar62 == bVar63;
        }
        else {
          bVar62 = *(long *)(LStack_4a0._0_8_ + iVar57 * 8) ==
                   *(long *)(LStack_430._0_8_ + iVar61 * 8);
        }
        if (bVar62) {
          iVar57 = iVar33;
          local_4d0 = iVar49 + 1;
          iVar33 = iVar49;
          oVar29.ptr = true_sel.ptr;
        }
        else {
          iVar57 = iVar33 + 1;
          local_4d0 = iVar49;
          oVar29.ptr = false_sel.ptr;
        }
        (oVar29.ptr)->sel_vector[iVar33] = (sel_t)iVar47;
        iVar52 = iVar52 + 1;
        iVar33 = iVar57;
        iVar49 = local_4d0;
      } while (count != iVar52);
    }
    break;
  default:
switchD_00b53525_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_4a8);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar35 = (float *)left->data;
        pfVar42 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar35,pfVar42);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            pfVar35 = pfVar35 + 1;
            pfVar42 = pfVar42 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar50 = 0;
          iVar33 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar35,pfVar42);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            uVar50 = uVar50 + 1;
            pfVar35 = pfVar35 + 1;
            pfVar42 = pfVar42 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar35,pfVar42);
              bVar62 = !bVar62;
            }
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
            pfVar35 = pfVar35 + 1;
            pfVar42 = pfVar42 + 1;
          } while (count != uVar50);
          goto LAB_00b61051;
        }
LAB_00b6104e:
        lVar48 = 0;
LAB_00b61051:
        return count - lVar48;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar35 = (float *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar42 = (float *)left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b61f1b:
              lVar48 = 0;
            }
            else {
              lVar48 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = Equals::Operation<float>(pfVar42,pfVar35);
                  bVar62 = !bVar62;
                }
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)bVar62;
                uVar50 = uVar50 + 1;
                pfVar42 = pfVar42 + 1;
              } while (count != uVar50);
            }
LAB_00b61f1e:
            iVar33 = count - lVar48;
            goto LAB_00b61f29;
          }
          if (count != 0) {
            uVar50 = 0;
            iVar33 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = Equals::Operation<float>(pfVar42,pfVar35);
              }
              (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
              iVar33 = iVar33 + bVar62;
              uVar50 = uVar50 + 1;
              pfVar42 = pfVar42 + 1;
            } while (count != uVar50);
            goto LAB_00b61f29;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar42,pfVar35);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            pfVar42 = pfVar42 + 1;
          } while (count != uVar50);
          goto LAB_00b61f29;
        }
LAB_00b5e62e:
        iVar33 = 0;
LAB_00b61f29:
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_4a0.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          return iVar33;
        }
        return iVar33;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar35 = (float *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar42 = (float *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62117;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = Equals::Operation<float>(pfVar35,pfVar42);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              pfVar42 = pfVar42 + 1;
            } while (count != uVar50);
            goto LAB_00b6211a;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = Equals::Operation<float>(pfVar35,pfVar42);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + bVar62;
              uVar50 = uVar50 + 1;
              pfVar42 = pfVar42 + 1;
              local_118.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar35,pfVar42);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            pfVar42 = pfVar42 + 1;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5fbec:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else {
          bVar62 = Equals::Operation<float>((float *)left->data,(float *)right->data);
          if (bVar62) goto LAB_00b5fbec;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    uVar14 = LStack_4a0._0_8_;
    uVar17 = LStack_430._0_8_;
    if (LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5f9fe;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            uVar60 = uVar50;
            if (lVar48 != 0) {
              uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
            }
            uVar28 = uVar50;
            if (psVar11 != (sel_t *)0x0) {
              uVar28 = (ulong)psVar11[uVar50];
            }
            bVar62 = Equals::Operation<float>
                               ((float *)(uVar14 + uVar60 * 4),(float *)(uVar17 + uVar28 * 4));
            if (!bVar62) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar30;
              lVar32 = lVar32 + 1;
            }
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b5fa00;
        }
        if (count == 0) goto LAB_00b5a49f;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        uVar50 = 0;
        local_4d0 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          uVar60 = uVar50;
          if (lVar48 != 0) {
            uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
          }
          uVar28 = uVar50;
          if (psVar11 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar11[uVar50];
          }
          bVar62 = Equals::Operation<float>
                             ((float *)(uVar14 + uVar60 * 4),(float *)(uVar17 + uVar28 * 4));
          if (bVar62) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + 1;
          }
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
      }
      else {
        if (count == 0) goto LAB_00b5a49f;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        uVar50 = 0;
        iVar33 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          uVar60 = uVar50;
          if (lVar48 != 0) {
            uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
          }
          uVar28 = uVar50;
          if (psVar11 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar11[uVar50];
          }
          bVar62 = Equals::Operation<float>
                             ((float *)(uVar14 + uVar60 * 4),(float *)(uVar17 + uVar28 * 4));
          if (bVar62) {
            iVar49 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            iVar52 = iVar33;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar52 = iVar33 + 1;
            iVar49 = iVar33;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar49] = (sel_t)uVar30;
          uVar50 = uVar50 + 1;
          iVar33 = iVar52;
        } while (count != uVar50);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) {
LAB_00b5f9fe:
          lVar32 = 0;
        }
        else {
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            uVar60 = uVar50;
            if (lVar48 != 0) {
              uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
            }
            uVar28 = uVar50;
            if (psVar11 != (sel_t *)0x0) {
              uVar28 = (ulong)psVar11[uVar50];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              if (bVar62 != bVar63) {
LAB_00b5ea85:
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar30;
                lVar32 = lVar32 + 1;
              }
            }
            else {
              bVar62 = Equals::Operation<float>
                                 ((float *)(uVar14 + uVar60 * 4),(float *)(uVar17 + uVar28 * 4));
              if (!bVar62) goto LAB_00b5ea85;
            }
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
        }
LAB_00b5fa00:
        local_4d0 = count - lVar32;
      }
      else {
        if (count == 0) goto LAB_00b5a49f;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        uVar50 = 0;
        local_4d0 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          uVar60 = uVar50;
          if (lVar48 != 0) {
            uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
          }
          uVar28 = uVar50;
          if (psVar11 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar11[uVar50];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 == bVar63) {
LAB_00b593c0:
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + 1;
            }
          }
          else {
            bVar62 = Equals::Operation<float>
                               ((float *)(uVar14 + uVar60 * 4),(float *)(uVar17 + uVar28 * 4));
            if (bVar62) goto LAB_00b593c0;
          }
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
      }
    }
    else {
      if (count == 0) goto LAB_00b5a49f;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      uVar50 = 0;
      do {
        uVar30 = uVar50;
        if (psVar10 != (sel_t *)0x0) {
          uVar30 = (ulong)psVar10[uVar50];
        }
        uVar60 = uVar50;
        if (lVar48 != 0) {
          uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
        }
        uVar28 = uVar50;
        if (psVar11 != (sel_t *)0x0) {
          uVar28 = (ulong)psVar11[uVar50];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) goto LAB_00b574c3;
LAB_00b5749b:
          iVar49 = iVar33;
          oVar29.ptr = false_sel.ptr;
          iVar33 = iVar33 + 1;
        }
        else {
          bVar62 = Equals::Operation<float>
                             ((float *)(uVar14 + uVar60 * 4),(float *)(uVar17 + uVar28 * 4));
          if (!bVar62) goto LAB_00b5749b;
LAB_00b574c3:
          iVar49 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar29.ptr)->sel_vector[iVar49] = (sel_t)uVar30;
        uVar50 = uVar50 + 1;
      } while (count != uVar50);
    }
    goto LAB_00b5fa0d;
  case DOUBLE:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar36 = (double *)left->data;
        pdVar43 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar36,pdVar43);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            pdVar36 = pdVar36 + 1;
            pdVar43 = pdVar43 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar50 = 0;
          iVar33 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar36,pdVar43);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            uVar50 = uVar50 + 1;
            pdVar36 = pdVar36 + 1;
            pdVar43 = pdVar43 + 1;
          } while (count != uVar50);
          return iVar33;
        }
        if (count != 0) {
          lVar48 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar36,pdVar43);
              bVar62 = !bVar62;
            }
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
            pdVar36 = pdVar36 + 1;
            pdVar43 = pdVar43 + 1;
          } while (count != uVar50);
          goto LAB_00b61051;
        }
        goto LAB_00b6104e;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar36 = (double *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar43 = (double *)left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b61f1b;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = Equals::Operation<double>(pdVar43,pdVar36);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              pdVar43 = pdVar43 + 1;
            } while (count != uVar50);
            goto LAB_00b61f1e;
          }
          if (count != 0) {
            uVar50 = 0;
            iVar33 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = Equals::Operation<double>(pdVar43,pdVar36);
              }
              (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
              iVar33 = iVar33 + bVar62;
              uVar50 = uVar50 + 1;
              pdVar43 = pdVar43 + 1;
            } while (count != uVar50);
            goto LAB_00b61f29;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar43,pdVar36);
            }
            (true_sel.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            pdVar43 = pdVar43 + 1;
          } while (count != uVar50);
          goto LAB_00b61f29;
        }
        goto LAB_00b5e62e;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar36 = (double *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar43 = (double *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62117;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = Equals::Operation<double>(pdVar36,pdVar43);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              pdVar43 = pdVar43 + 1;
            } while (count != uVar50);
            goto LAB_00b6211a;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = Equals::Operation<double>(pdVar36,pdVar43);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + bVar62;
              uVar50 = uVar50 + 1;
              pdVar43 = pdVar43 + 1;
              local_118.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(sel.ptr)->sel_vector[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar36,pdVar43);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + bVar62;
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)(bVar62 ^ 1);
            uVar50 = uVar50 + 1;
            pdVar43 = pdVar43 + 1;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b5fe43:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar33 = 0;
              do {
                sVar46 = (sel_t)iVar33;
                if (psVar10 != (sel_t *)0x0) {
                  sVar46 = psVar10[iVar33];
                }
                psVar11[iVar33] = sVar46;
                iVar33 = iVar33 + 1;
              } while (count != iVar33);
              return count;
            }
            return count;
          }
        }
        else {
          bVar62 = Equals::Operation<double>((double *)left->data,(double *)right->data);
          if (bVar62) goto LAB_00b5fe43;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          psVar11[iVar33] = sVar46;
          iVar33 = iVar33 + 1;
        } while (count != iVar33);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    uVar14 = LStack_4a0._0_8_;
    uVar17 = LStack_430._0_8_;
    if (LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b5f9fe;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          lVar32 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            uVar60 = uVar50;
            if (lVar48 != 0) {
              uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
            }
            uVar28 = uVar50;
            if (psVar11 != (sel_t *)0x0) {
              uVar28 = (ulong)psVar11[uVar50];
            }
            bVar62 = Equals::Operation<double>
                               ((double *)(uVar14 + uVar60 * 8),(double *)(uVar17 + uVar28 * 8));
            if (!bVar62) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar30;
              lVar32 = lVar32 + 1;
            }
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_00b5fa00;
        }
        if (count == 0) goto LAB_00b5a49f;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        uVar50 = 0;
        local_4d0 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          uVar60 = uVar50;
          if (lVar48 != 0) {
            uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
          }
          uVar28 = uVar50;
          if (psVar11 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar11[uVar50];
          }
          bVar62 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar60 * 8),(double *)(uVar17 + uVar28 * 8));
          if (bVar62) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + 1;
          }
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
      }
      else {
        if (count == 0) goto LAB_00b5a49f;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        local_4d0 = 0;
        uVar50 = 0;
        iVar33 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          uVar60 = uVar50;
          if (lVar48 != 0) {
            uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
          }
          uVar28 = uVar50;
          if (psVar11 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar11[uVar50];
          }
          bVar62 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar60 * 8),(double *)(uVar17 + uVar28 * 8));
          if (bVar62) {
            iVar49 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            iVar52 = iVar33;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar52 = iVar33 + 1;
            iVar49 = iVar33;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar49] = (sel_t)uVar30;
          uVar50 = uVar50 + 1;
          iVar33 = iVar52;
        } while (count != uVar50);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b5f9fe;
        psVar10 = (sel.ptr)->sel_vector;
        lVar48 = *(long *)local_4a8;
        psVar11 = *(sel_t **)local_438;
        lVar32 = 0;
        uVar50 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          uVar60 = uVar50;
          if (lVar48 != 0) {
            uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
          }
          uVar28 = uVar50;
          if (psVar11 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar11[uVar50];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 != bVar63) {
LAB_00b5ef46:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar30;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            bVar62 = Equals::Operation<double>
                               ((double *)(uVar14 + uVar60 * 8),(double *)(uVar17 + uVar28 * 8));
            if (!bVar62) goto LAB_00b5ef46;
          }
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
        goto LAB_00b5fa00;
      }
      if (count == 0) goto LAB_00b5a49f;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      uVar50 = 0;
      local_4d0 = 0;
      do {
        uVar30 = uVar50;
        if (psVar10 != (sel_t *)0x0) {
          uVar30 = (ulong)psVar10[uVar50];
        }
        uVar60 = uVar50;
        if (lVar48 != 0) {
          uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
        }
        uVar28 = uVar50;
        if (psVar11 != (sel_t *)0x0) {
          uVar28 = (ulong)psVar11[uVar50];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) {
LAB_00b598ec:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          bVar62 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar60 * 8),(double *)(uVar17 + uVar28 * 8));
          if (bVar62) goto LAB_00b598ec;
        }
        uVar50 = uVar50 + 1;
      } while (count != uVar50);
    }
    else {
      if (count == 0) goto LAB_00b5a49f;
      psVar10 = (sel.ptr)->sel_vector;
      lVar48 = *(long *)local_4a8;
      psVar11 = *(sel_t **)local_438;
      iVar33 = 0;
      local_4d0 = 0;
      uVar50 = 0;
      do {
        uVar30 = uVar50;
        if (psVar10 != (sel_t *)0x0) {
          uVar30 = (ulong)psVar10[uVar50];
        }
        uVar60 = uVar50;
        if (lVar48 != 0) {
          uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
        }
        uVar28 = uVar50;
        if (psVar11 != (sel_t *)0x0) {
          uVar28 = (ulong)psVar11[uVar50];
        }
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
        }
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 == bVar63) goto LAB_00b577de;
LAB_00b577b6:
          iVar49 = iVar33;
          oVar29.ptr = false_sel.ptr;
          iVar33 = iVar33 + 1;
        }
        else {
          bVar62 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar60 * 8),(double *)(uVar17 + uVar28 * 8));
          if (!bVar62) goto LAB_00b577b6;
LAB_00b577de:
          iVar49 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar29.ptr)->sel_vector[iVar49] = (sel_t)uVar30;
        uVar50 = uVar50 + 1;
      } while (count != uVar50);
    }
    goto LAB_00b5fa0d;
  case INTERVAL:
    local_298 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_298);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_298);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_298);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar32 = 8;
          lVar48 = 0;
          iVar33 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              iVar39 = *(int *)(pdVar7 + lVar32 + -4);
              iVar56 = *(int *)(pdVar9 + lVar32 + -4);
              lVar59 = *(long *)(pdVar7 + lVar32);
              lVar55 = *(long *)(pdVar9 + lVar32);
              if (((*(int *)(pdVar7 + lVar32 + -8) == *(int *)(pdVar9 + lVar32 + -8)) &&
                  (iVar39 == iVar56)) && (iVar56 = iVar39, lVar59 == lVar55)) {
                bVar62 = false;
              }
              else {
                lVar51 = (long)iVar39 + lVar59 / 86400000000;
                lVar54 = (long)iVar56 + lVar55 / 86400000000;
                bVar62 = true;
                if (((long)*(int *)(pdVar7 + lVar32 + -8) + lVar51 / 0x1e ==
                     (long)*(int *)(pdVar9 + lVar32 + -8) + lVar54 / 0x1e) &&
                   (bVar62 = true, lVar51 % 0x1e == lVar54 % 0x1e)) {
                  bVar62 = lVar59 % 86400000000 != lVar55 % 86400000000;
                }
              }
            }
            psVar11[iVar33] = (sel_t)uVar30;
            iVar33 = iVar33 + (bVar62 ^ 1);
            psVar8[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
            lVar32 = lVar32 + 0x10;
          } while (count != uVar50);
          return iVar33;
        }
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar48 = 0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar32 = 8;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                iVar39 = *(int *)(pdVar7 + lVar32 + -4);
                iVar56 = *(int *)(pdVar9 + lVar32 + -4);
                lVar59 = *(long *)(pdVar7 + lVar32);
                lVar55 = *(long *)(pdVar9 + lVar32);
                if (((*(int *)(pdVar7 + lVar32 + -8) == *(int *)(pdVar9 + lVar32 + -8)) &&
                    (iVar39 == iVar56)) && (iVar56 = iVar39, lVar59 == lVar55)) {
                  bVar62 = false;
                }
                else {
                  lVar51 = (long)iVar39 + lVar59 / 86400000000;
                  lVar54 = (long)iVar56 + lVar55 / 86400000000;
                  bVar62 = true;
                  if (((long)*(int *)(pdVar7 + lVar32 + -8) + lVar51 / 0x1e ==
                       (long)*(int *)(pdVar9 + lVar32 + -8) + lVar54 / 0x1e) &&
                     (bVar62 = true, lVar51 % 0x1e == lVar54 % 0x1e)) {
                    bVar62 = lVar59 % 86400000000 != lVar55 % 86400000000;
                  }
                }
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              lVar32 = lVar32 + 0x10;
            } while (count != uVar50);
          }
          return count - lVar48;
        }
        if (count == 0) {
          return 0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (true_sel.ptr)->sel_vector;
        lVar48 = 8;
        uVar50 = 0;
        iVar33 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          if (puVar2 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
          }
          if (puVar3 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            iVar39 = *(int *)(pdVar7 + lVar48 + -4);
            iVar56 = *(int *)(pdVar9 + lVar48 + -4);
            lVar32 = *(long *)(pdVar7 + lVar48);
            lVar59 = *(long *)(pdVar9 + lVar48);
            if (((*(int *)(pdVar7 + lVar48 + -8) == *(int *)(pdVar9 + lVar48 + -8)) &&
                (iVar39 == iVar56)) && (iVar56 = iVar39, lVar32 == lVar59)) {
              bVar62 = false;
            }
            else {
              lVar55 = (long)iVar39 + lVar32 / 86400000000;
              lVar51 = (long)iVar56 + lVar59 / 86400000000;
              bVar62 = true;
              if (((long)*(int *)(pdVar7 + lVar48 + -8) + lVar55 / 0x1e ==
                   (long)*(int *)(pdVar9 + lVar48 + -8) + lVar51 / 0x1e) &&
                 (bVar62 = true, lVar55 % 0x1e == lVar51 % 0x1e)) {
                bVar62 = lVar32 % 86400000000 != lVar59 % 86400000000;
              }
            }
          }
          psVar11[iVar33] = (sel_t)uVar30;
          iVar33 = iVar33 + (bVar62 ^ 1);
          uVar50 = uVar50 + 1;
          lVar48 = lVar48 + 0x10;
        } while (count != uVar50);
        return iVar33;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar22 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b62117:
              lVar48 = 0;
            }
            else {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (false_sel.ptr)->sel_vector;
              plVar40 = (long *)(pdVar7 + 8);
              lVar48 = 0;
              uVar50 = 0;
              do {
                uVar30 = uVar50;
                if (psVar10 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar10[uVar50];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  iVar39 = *(int *)((long)plVar40 + -4);
                  lVar32 = *plVar40;
                  lVar59 = *(long *)(piVar22 + 2);
                  iVar56 = piVar22[1];
                  if ((piVar22[1] == iVar39 && *piVar22 == (int)plVar40[-1]) &&
                     (iVar56 = iVar39, lVar32 == lVar59)) {
                    bVar62 = false;
                  }
                  else {
                    lVar55 = (long)iVar39 + lVar32 / 86400000000;
                    lVar51 = (long)iVar56 + lVar59 / 86400000000;
                    bVar62 = true;
                    if (((long)(int)plVar40[-1] + lVar55 / 0x1e == (long)*piVar22 + lVar51 / 0x1e)
                       && (bVar62 = true, lVar55 % 0x1e == lVar51 % 0x1e)) {
                      bVar62 = lVar32 % 86400000000 != lVar59 % 86400000000;
                    }
                  }
                }
                psVar11[lVar48] = (sel_t)uVar30;
                lVar48 = lVar48 + (ulong)bVar62;
                uVar50 = uVar50 + 1;
                plVar40 = plVar40 + 2;
              } while (count != uVar50);
            }
LAB_00b6211a:
            local_4d0 = count - lVar48;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b62267;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            plVar40 = (long *)(pdVar7 + 8);
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                iVar39 = *(int *)((long)plVar40 + -4);
                lVar48 = *plVar40;
                lVar32 = *(long *)(piVar22 + 2);
                iVar56 = piVar22[1];
                if ((piVar22[1] == iVar39 && *piVar22 == (int)plVar40[-1]) &&
                   (iVar56 = iVar39, lVar48 == lVar32)) {
                  bVar62 = false;
                }
                else {
                  lVar59 = (long)iVar39 + lVar48 / 86400000000;
                  lVar55 = (long)iVar56 + lVar32 / 86400000000;
                  bVar62 = true;
                  if (((long)(int)plVar40[-1] + lVar59 / 0x1e == (long)*piVar22 + lVar55 / 0x1e) &&
                     (bVar62 = true, lVar59 % 0x1e == lVar55 % 0x1e)) {
                    bVar62 = lVar48 % 86400000000 != lVar32 % 86400000000;
                  }
                }
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
              plVar40 = plVar40 + 2;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          local_440.ptr = (ValidityMask *)(true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          plVar40 = (long *)(pdVar7 + 8);
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              iVar39 = *(int *)((long)plVar40 + -4);
              lVar32 = *plVar40;
              lVar59 = *(long *)(piVar22 + 2);
              iVar56 = piVar22[1];
              if ((piVar22[1] == iVar39 && *piVar22 == (int)plVar40[-1]) &&
                 (iVar56 = iVar39, lVar32 == lVar59)) {
                bVar62 = false;
              }
              else {
                lVar55 = (long)iVar39 + lVar32 / 86400000000;
                lVar51 = (long)iVar56 + lVar59 / 86400000000;
                bVar62 = true;
                if (((long)(int)plVar40[-1] + lVar55 / 0x1e == (long)*piVar22 + lVar51 / 0x1e) &&
                   (bVar62 = true, lVar55 % 0x1e == lVar51 % 0x1e)) {
                  bVar62 = lVar32 % 86400000000 != lVar59 % 86400000000;
                }
              }
            }
            *(sel_t *)((long)&((element_type *)local_440.ptr)->_vptr_ExtraTypeInfo + local_4d0 * 4)
                 = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
            plVar40 = plVar40 + 2;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
LAB_00b5e975:
        local_4d0 = 0;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_00b62267;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar22 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_318._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_318);
          peVar15 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar16 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          auVar13 = _local_438;
          local_438[0] = auVar16[0];
          local_438[1] = auVar16[1];
          local_438._2_6_ = auVar16._2_6_;
          LStack_4a0.id_ = local_438[0];
          LStack_4a0.physical_type_ = local_438[1];
          LStack_4a0._2_6_ = local_438._2_6_;
          _local_438 = auVar13;
          if (peVar15 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
          }
          pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          local_4a8 = *(undefined1 (*) [8])
                       &(pTVar27->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_4a8 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b62117;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            plVar40 = (long *)(pdVar7 + 8);
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                iVar39 = piVar22[1];
                lVar32 = *(long *)(piVar22 + 2);
                lVar59 = *plVar40;
                iVar56 = *(int *)((long)plVar40 + -4);
                if ((*(int *)((long)plVar40 + -4) == iVar39 && (int)plVar40[-1] == *piVar22) &&
                   (iVar56 = iVar39, lVar32 == lVar59)) {
                  bVar62 = false;
                }
                else {
                  lVar55 = (long)iVar39 + lVar32 / 86400000000;
                  lVar51 = (long)iVar56 + lVar59 / 86400000000;
                  bVar62 = true;
                  if (((long)*piVar22 + lVar55 / 0x1e == (long)(int)plVar40[-1] + lVar51 / 0x1e) &&
                     (bVar62 = true, lVar55 % 0x1e == lVar51 % 0x1e)) {
                    bVar62 = lVar32 % 86400000000 != lVar59 % 86400000000;
                  }
                }
              }
              psVar11[lVar48] = (sel_t)uVar30;
              lVar48 = lVar48 + (ulong)bVar62;
              uVar50 = uVar50 + 1;
              plVar40 = plVar40 + 2;
            } while (count != uVar50);
            goto LAB_00b6211a;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            plVar40 = (long *)(pdVar7 + 8);
            uVar50 = 0;
            local_4d0 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                iVar39 = piVar22[1];
                lVar48 = *(long *)(piVar22 + 2);
                lVar32 = *plVar40;
                iVar56 = *(int *)((long)plVar40 + -4);
                if ((*(int *)((long)plVar40 + -4) == iVar39 && (int)plVar40[-1] == *piVar22) &&
                   (iVar56 = iVar39, lVar48 == lVar32)) {
                  bVar62 = false;
                }
                else {
                  lVar59 = (long)iVar39 + lVar48 / 86400000000;
                  lVar55 = (long)iVar56 + lVar32 / 86400000000;
                  bVar62 = true;
                  if (((long)*piVar22 + lVar59 / 0x1e == (long)(int)plVar40[-1] + lVar55 / 0x1e) &&
                     (bVar62 = true, lVar59 % 0x1e == lVar55 % 0x1e)) {
                    bVar62 = lVar48 % 86400000000 != lVar32 % 86400000000;
                  }
                }
              }
              psVar11[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + (bVar62 ^ 1);
              uVar50 = uVar50 + 1;
              plVar40 = plVar40 + 2;
            } while (count != uVar50);
            goto LAB_00b62267;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          local_440.ptr = (ValidityMask *)(true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          plVar40 = (long *)(pdVar7 + 8);
          lVar48 = 0;
          local_4d0 = 0;
          uVar50 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              iVar39 = piVar22[1];
              lVar32 = *(long *)(piVar22 + 2);
              lVar59 = *plVar40;
              iVar56 = *(int *)((long)plVar40 + -4);
              if ((*(int *)((long)plVar40 + -4) == iVar39 && (int)plVar40[-1] == *piVar22) &&
                 (iVar56 = iVar39, lVar32 == lVar59)) {
                bVar62 = false;
              }
              else {
                lVar55 = (long)iVar39 + lVar32 / 86400000000;
                lVar51 = (long)iVar56 + lVar59 / 86400000000;
                bVar62 = true;
                if (((long)*piVar22 + lVar55 / 0x1e == (long)(int)plVar40[-1] + lVar51 / 0x1e) &&
                   (bVar62 = true, lVar55 % 0x1e == lVar51 % 0x1e)) {
                  bVar62 = lVar32 % 86400000000 != lVar59 % 86400000000;
                }
              }
            }
            *(sel_t *)((long)&((element_type *)local_440.ptr)->_vptr_ExtraTypeInfo + local_4d0 * 4)
                 = (sel_t)uVar30;
            local_4d0 = local_4d0 + (bVar62 ^ 1);
            psVar11[lVar48] = (sel_t)uVar30;
            lVar48 = lVar48 + (ulong)bVar62;
            uVar50 = uVar50 + 1;
            plVar40 = plVar40 + 2;
          } while (count != uVar50);
          goto LAB_00b62267;
        }
        goto LAB_00b5e975;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar3 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          if (bVar62 != bVar63) {
LAB_00b5fde5:
            if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            iVar33 = 0;
            do {
              sVar46 = (sel_t)iVar33;
              if (psVar10 != (sel_t *)0x0) {
                sVar46 = psVar10[iVar33];
              }
              psVar11[iVar33] = sVar46;
              iVar33 = iVar33 + 1;
            } while (count != iVar33);
            return 0;
          }
        }
        else {
          piVar22 = (int *)left->data;
          piVar31 = (int *)right->data;
          iVar39 = piVar22[1];
          lVar48 = *(long *)(piVar22 + 2);
          lVar32 = *(long *)(piVar31 + 2);
          iVar56 = piVar31[1];
          if ((piVar31[1] != iVar39 || *piVar31 != *piVar22) || (iVar56 = iVar39, lVar48 != lVar32))
          {
            lVar59 = (long)iVar39 + lVar48 / 86400000000;
            lVar55 = (long)iVar56 + lVar32 / 86400000000;
            if (((long)*piVar22 + lVar59 / 0x1e != (long)*piVar31 + lVar55 / 0x1e) ||
               ((lVar59 % 0x1e != lVar55 % 0x1e || (lVar48 % 86400000000 != lVar32 % 86400000000))))
            goto LAB_00b5fde5;
          }
        }
        if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          iVar33 = 0;
          do {
            sVar46 = (sel_t)iVar33;
            if (psVar10 != (sel_t *)0x0) {
              sVar46 = psVar10[iVar33];
            }
            psVar11[iVar33] = sVar46;
            iVar33 = iVar33 + 1;
          } while (count != iVar33);
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            local_4b8 = 0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_438;
            local_4b8 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              uVar60 = uVar50;
              if (lVar48 != 0) {
                uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
              }
              uVar28 = uVar50;
              if (psVar11 != (sel_t *)0x0) {
                uVar28 = (ulong)psVar11[uVar50];
              }
              lVar55 = uVar28 * 0x10;
              iVar39 = *(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4);
              iVar56 = *(int *)(LStack_430._0_8_ + lVar55 + 4);
              lVar32 = *(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8);
              lVar59 = *(long *)(LStack_430._0_8_ + lVar55 + 8);
              if (((*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) !=
                    *(int *)(LStack_430._0_8_ + lVar55)) || (iVar39 != iVar56)) ||
                 (iVar56 = iVar39, lVar32 != lVar59)) {
                lVar51 = (long)iVar39 + lVar32 / 86400000000;
                lVar54 = (long)iVar56 + lVar59 / 86400000000;
                if ((((long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) + lVar51 / 0x1e !=
                      (long)*(int *)(LStack_430._0_8_ + lVar55) + lVar54 / 0x1e) ||
                    (lVar51 % 0x1e != lVar54 % 0x1e)) ||
                   (lVar32 % 86400000000 != lVar59 % 86400000000)) {
                  (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)uVar30;
                  local_4b8 = local_4b8 + 1;
                }
              }
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
          }
          local_4d0 = count - local_4b8;
        }
        else {
          if (count == 0) goto LAB_00b5a49f;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar11 = *(sel_t **)local_438;
          uVar50 = 0;
          local_4d0 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            uVar60 = uVar50;
            if (lVar48 != 0) {
              uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
            }
            uVar28 = uVar50;
            if (psVar11 != (sel_t *)0x0) {
              uVar28 = (ulong)psVar11[uVar50];
            }
            lVar55 = uVar28 * 0x10;
            iVar39 = *(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4);
            iVar56 = *(int *)(LStack_430._0_8_ + lVar55 + 4);
            lVar32 = *(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8);
            lVar59 = *(long *)(LStack_430._0_8_ + lVar55 + 8);
            if (((*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) == *(int *)(LStack_430._0_8_ + lVar55))
                && (iVar39 == iVar56)) && (iVar56 = iVar39, lVar32 == lVar59)) {
LAB_00b5956f:
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + 1;
            }
            else {
              lVar51 = (long)iVar39 + lVar32 / 86400000000;
              lVar54 = (long)iVar56 + lVar59 / 86400000000;
              if ((((long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) + lVar51 / 0x1e ==
                    (long)*(int *)(LStack_430._0_8_ + lVar55) + lVar54 / 0x1e) &&
                  (lVar51 % 0x1e == lVar54 % 0x1e)) &&
                 (lVar32 % 86400000000 == lVar59 % 86400000000)) goto LAB_00b5956f;
            }
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
        }
      }
      else if (count == 0) {
LAB_00b5a49f:
        local_4d0 = 0;
      }
      else {
        psVar10 = (sel.ptr)->sel_vector;
        local_440.ptr = *(ValidityMask **)local_4a8;
        local_3c8 = *(sel_t **)local_438;
        local_4b0 = 0;
        local_4d0 = 0;
        uVar50 = 0;
        do {
          uVar30 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar10[uVar50];
          }
          uVar60 = uVar50;
          if ((element_type *)local_440.ptr != (element_type *)0x0) {
            uVar60 = (ulong)*(uint *)((long)&((element_type *)local_440.ptr)->_vptr_ExtraTypeInfo +
                                     uVar50 * 4);
          }
          uVar28 = uVar50;
          if (local_3c8 != (sel_t *)0x0) {
            uVar28 = (ulong)local_3c8[uVar50];
          }
          lVar59 = uVar28 * 0x10;
          iVar39 = *(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4);
          iVar56 = *(int *)(LStack_430._0_8_ + lVar59 + 4);
          lVar48 = *(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8);
          lVar32 = *(long *)(LStack_430._0_8_ + lVar59 + 8);
          if (((*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) == *(int *)(LStack_430._0_8_ + lVar59))
              && (iVar39 == iVar56)) && (iVar56 = iVar39, lVar48 == lVar32)) {
LAB_00b555da:
            iVar33 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          else {
            lVar55 = (long)iVar39 + lVar48 / 86400000000;
            lVar51 = (long)iVar56 + lVar32 / 86400000000;
            if ((((long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) + lVar55 / 0x1e ==
                  (long)*(int *)(LStack_430._0_8_ + lVar59) + lVar51 / 0x1e) &&
                (lVar55 % 0x1e == lVar51 % 0x1e)) && (lVar48 % 86400000000 == lVar32 % 86400000000))
            goto LAB_00b555da;
            iVar33 = local_4b0;
            oVar29.ptr = false_sel.ptr;
            local_4b0 = local_4b0 + 1;
          }
          (oVar29.ptr)->sel_vector[iVar33] = (sel_t)uVar30;
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
      }
    }
    else {
      local_440.ptr =
           (ValidityMask *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar48 = 0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            local_3c8 = *(sel_t **)local_4a8;
            psVar11 = *(sel_t **)local_438;
            lVar48 = 0;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar50];
              }
              uVar60 = uVar50;
              if (local_3c8 != (sel_t *)0x0) {
                uVar60 = (ulong)local_3c8[uVar50];
              }
              uVar28 = uVar50;
              if (psVar11 != (sel_t *)0x0) {
                uVar28 = (ulong)psVar11[uVar50];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) &
                         1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                if (bVar62 != bVar63) {
LAB_00b5ee13:
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar30;
                  lVar48 = lVar48 + 1;
                }
              }
              else {
                piVar22 = (int *)(LStack_4a0._0_8_ + uVar60 * 0x10);
                piVar31 = (int *)(LStack_430._0_8_ + uVar28 * 0x10);
                iVar39 = piVar22[1];
                iVar56 = piVar31[1];
                lVar32 = *(long *)(piVar22 + 2);
                lVar59 = *(long *)(piVar31 + 2);
                if (((*piVar22 != *piVar31) || (iVar39 != iVar56)) ||
                   (iVar56 = iVar39, lVar32 != lVar59)) {
                  lVar55 = (long)iVar39 + lVar32 / 86400000000;
                  lVar51 = (long)iVar56 + lVar59 / 86400000000;
                  if ((((long)*piVar22 + lVar55 / 0x1e != (long)*piVar31 + lVar51 / 0x1e) ||
                      (lVar55 % 0x1e != lVar51 % 0x1e)) ||
                     (lVar32 % 86400000000 != lVar59 % 86400000000)) goto LAB_00b5ee13;
                }
              }
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
          }
          local_4d0 = count - lVar48;
        }
        else {
          if (count == 0) goto LAB_00b5a49f;
          psVar10 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          local_3c8 = *(sel_t **)local_438;
          uVar50 = 0;
          local_4d0 = 0;
          do {
            uVar30 = uVar50;
            if (psVar10 != (sel_t *)0x0) {
              uVar30 = (ulong)psVar10[uVar50];
            }
            uVar60 = uVar50;
            if (lVar48 != 0) {
              uVar60 = (ulong)*(uint *)(lVar48 + uVar50 * 4);
            }
            uVar28 = uVar50;
            if (local_3c8 != (sel_t *)0x0) {
              uVar28 = (ulong)local_3c8[uVar50];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              if (bVar62 == bVar63) goto LAB_00b5976c;
            }
            else {
              piVar22 = (int *)(LStack_4a0._0_8_ + uVar60 * 0x10);
              piVar31 = (int *)(LStack_430._0_8_ + uVar28 * 0x10);
              iVar39 = piVar22[1];
              iVar56 = piVar31[1];
              lVar32 = *(long *)(piVar22 + 2);
              lVar59 = *(long *)(piVar31 + 2);
              if (((*piVar22 != *piVar31) || (iVar39 != iVar56)) ||
                 (iVar56 = iVar39, lVar32 != lVar59)) {
                lVar55 = (long)iVar39 + lVar32 / 86400000000;
                lVar51 = (long)iVar56 + lVar59 / 86400000000;
                if ((((long)*piVar22 + lVar55 / 0x1e != (long)*piVar31 + lVar51 / 0x1e) ||
                    (lVar55 % 0x1e != lVar51 % 0x1e)) ||
                   (lVar32 % 86400000000 != lVar59 % 86400000000)) goto LAB_00b597a4;
              }
LAB_00b5976c:
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar30;
              local_4d0 = local_4d0 + 1;
            }
LAB_00b597a4:
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
        }
      }
      else {
        if (count == 0) goto LAB_00b5a49f;
        local_3c8 = (sel.ptr)->sel_vector;
        local_158 = *(long *)local_4a8;
        psVar10 = *(sel_t **)local_438;
        iVar33 = 0;
        local_4d0 = 0;
        uVar50 = 0;
        do {
          uVar30 = uVar50;
          if (local_3c8 != (sel_t *)0x0) {
            uVar30 = (ulong)local_3c8[uVar50];
          }
          uVar60 = uVar50;
          if (local_158 != 0) {
            uVar60 = (ulong)*(uint *)(local_158 + uVar50 * 4);
          }
          uVar28 = uVar50;
          if (psVar10 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar10[uVar50];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar28 >> 6] >> (uVar28 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            if (bVar62 == bVar63) goto LAB_00b576b4;
LAB_00b576cc:
            iVar49 = iVar33;
            oVar29.ptr = false_sel.ptr;
            iVar33 = iVar33 + 1;
          }
          else {
            piVar22 = (int *)(LStack_4a0._0_8_ + uVar60 * 0x10);
            piVar31 = (int *)(LStack_430._0_8_ + uVar28 * 0x10);
            iVar39 = piVar22[1];
            iVar56 = piVar31[1];
            lVar48 = *(long *)(piVar22 + 2);
            lVar32 = *(long *)(piVar31 + 2);
            if (((*piVar22 != *piVar31) || (iVar39 != iVar56)) ||
               (iVar56 = iVar39, lVar48 != lVar32)) {
              lVar59 = (long)iVar39 + lVar48 / 86400000000;
              lVar55 = (long)iVar56 + lVar32 / 86400000000;
              if ((((long)*piVar22 + lVar59 / 0x1e != (long)*piVar31 + lVar55 / 0x1e) ||
                  (lVar59 % 0x1e != lVar55 % 0x1e)) ||
                 (lVar48 % 86400000000 != lVar32 % 86400000000)) goto LAB_00b576cc;
            }
LAB_00b576b4:
            iVar49 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar29.ptr)->sel_vector[iVar49] = (sel_t)uVar30;
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
      }
    }
LAB_00b5fa0d:
    if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
    }
    goto joined_r0x00b5fa2f;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_2b0.ptr = false_sel.ptr;
    local_2a8.ptr = true_sel.ptr;
    local_2a0.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_2a0.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_150,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_210,&local_130);
    SelectionVector::SelectionVector(&local_3a0,count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_2a0);
    oVar26.ptr = local_2a0.ptr;
    local_1f0.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_438);
    if (LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4b0 = 0;
        uVar50 = 0;
      }
      else {
        psVar10 = (oVar26.ptr)->sel_vector;
        local_4b0 = 0;
        iVar33 = 0;
        do {
          sVar46 = (sel_t)iVar33;
          if (psVar10 != (sel_t *)0x0) {
            sVar46 = psVar10[iVar33];
          }
          *(sel_t *)((long)(sel_t **)local_3a0.sel_vector + iVar33 * 4) = sVar46;
          iVar33 = iVar33 + 1;
          uVar50 = count;
        } while (count != iVar33);
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_318,count);
      if (count == 0) {
        local_4b0 = 0;
        lVar48 = 0;
        uVar50 = 0;
      }
      else {
        local_4b0 = 0;
        uVar50 = 0;
        uVar30 = 0;
        lVar48 = 0;
        do {
          psVar10 = (oVar26.ptr)->sel_vector;
          uVar60 = uVar30;
          if (psVar10 != (sel_t *)0x0) {
            uVar60 = (ulong)psVar10[uVar30];
          }
          uVar28 = uVar30;
          if (*(long *)local_4a8 != 0) {
            uVar28 = (ulong)*(uint *)(*(long *)local_4a8 + uVar30 * 4);
          }
          uVar18 = uVar30;
          if (*(sel_t **)local_438 != (sel_t *)0x0) {
            uVar18 = (ulong)(*(sel_t **)local_438)[uVar30];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar28 >> 6) * 8) >> (uVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar18 >> 6] >> (uVar18 & 0x3f) & 1)
                     == 0;
          }
          uVar34 = (undefined4)uVar60;
          if ((bVar62 | bVar63) == 1) {
            if (local_1f0.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_1f0);
              pSVar25 = local_1f0.sel;
              _Var19._M_head_impl =
                   ((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector)->
                   validity_mask;
              if (_Var19._M_head_impl == (unsigned_long *)0x0) {
                local_1a8.sel = (SelectionVector *)local_1f0.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_298,(unsigned_long *)&local_1a8);
                auVar16 = local_298;
                uVar14 = aLStack_290[0]._0_8_;
                _local_298 = (undefined1  [16])0x0;
                p_Var21 = (pSVar25->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar25->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar16;
                (pSVar25->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14;
                if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_290[0]._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_290[0]._0_8_)
                    ;
                  }
                }
                pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar25->selection_data);
                _Var19._M_head_impl =
                     (pTVar27->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                ((TemplatedValidityMask<unsigned_long> *)&pSVar25->sel_vector)->validity_mask =
                     _Var19._M_head_impl;
              }
              bVar12 = (byte)uVar60 & 0x3f;
              _Var19._M_head_impl[uVar60 >> 6] =
                   _Var19._M_head_impl[uVar60 >> 6] &
                   (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
            }
            if (bVar62 == bVar63) {
              if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_150.sel)->sel_vector)->sel_vector +
                 local_4b0 * 4) = uVar34;
              }
              local_4b0 = local_4b0 + 1;
            }
            else {
              if ((OptionalSelection *)local_210.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_210.sel)->sel_vector)->sel_vector + lVar48 * 4)
                     = uVar34;
              }
              lVar48 = lVar48 + 1;
            }
          }
          else {
            *(sel_t *)(local_318._0_8_ + uVar50 * 4) = (sel_t)uVar30;
            *(undefined4 *)((long)(sel_t **)local_3a0.sel_vector + uVar50 * 4) = uVar34;
            uVar50 = uVar50 + 1;
          }
          uVar30 = uVar30 + 1;
        } while (count != uVar30);
      }
      pSVar25 = local_150.sel;
      if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
        pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
        }
        pSVar25->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + local_4b0 * 4);
      }
      pSVar25 = local_210.sel;
      if ((OptionalSelection *)local_210.sel != (OptionalSelection *)0x0) {
        pSVar4 = (SelectionVector *)(local_210.sel)->sel_vector;
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_210.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_210.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_210.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
        }
        pSVar25->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar48 * 4);
      }
      if (uVar50 < count && uVar50 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_318,uVar50);
        Vector::Slice(&local_98,(SelectionVector *)&local_318,uVar50);
      }
      if (local_318.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_318.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
    }
    if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
    }
    if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
    }
    if (local_488._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
    }
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar50 == 0) goto LAB_00b54d3f;
      SelectionVector::SelectionVector(&local_370,uVar50);
      SelectionVector::SelectionVector(&local_388,uVar50);
      pVVar20 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_4a8,pVVar20);
      pVVar20 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_438,pVVar20);
      iVar33 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_4a8,iVar33);
      iVar33 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_438,iVar33);
      Vector::Vector(&local_318,(Vector *)local_4a8,&local_370,uVar50);
      Vector::Vector((Vector *)local_298,(Vector *)local_438,&local_388,uVar50);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_1a8);
      Vector::ToUnifiedFormat(&local_100,uVar50,&local_1a8);
      pdVar9 = local_1a8.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_1f0);
      Vector::ToUnifiedFormat(&local_98,uVar50,&local_1f0);
      pdVar7 = local_1f0.data;
      SelectionVector::SelectionVector(&local_3b8,uVar50);
      auVar13 = _DAT_012acff0;
      lVar48 = uVar50 - 1;
      auVar66._8_4_ = (int)lVar48;
      auVar66._0_8_ = lVar48;
      auVar66._12_4_ = (int)((ulong)lVar48 >> 0x20);
      uVar30 = 0;
      auVar66 = auVar66 ^ _DAT_012acff0;
      auVar68 = _DAT_012acfe0;
      do {
        auVar69 = auVar68 ^ auVar13;
        if ((bool)(~(auVar69._4_4_ == auVar66._4_4_ && auVar66._0_4_ < auVar69._0_4_ ||
                    auVar66._4_4_ < auVar69._4_4_) & 1)) {
          local_3b8.sel_vector[uVar30] = (sel_t)uVar30;
        }
        if ((auVar69._12_4_ != auVar66._12_4_ || auVar69._8_4_ <= auVar66._8_4_) &&
            auVar69._12_4_ <= auVar66._12_4_) {
          local_3b8.sel_vector[uVar30 + 1] = (sel_t)uVar30 + 1;
        }
        uVar30 = uVar30 + 2;
        lVar48 = auVar68._8_8_;
        auVar68._0_8_ = auVar68._0_8_ + 2;
        auVar68._8_8_ = lVar48 + 2;
      } while ((uVar50 + 1 & 0xfffffffffffffffe) != uVar30);
      SelectionVector::SelectionVector((SelectionVector *)(local_358 + 0x28),uVar50);
      SelectionVector::SelectionVector(&local_228,uVar50);
      local_358._0_16_ = (undefined1  [16])0x0;
      local_358._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_358._24_8_ = 0x800;
      if (local_3c0.ptr == (ValidityMask *)0x0) {
        local_440.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
        iVar33 = ValidityMask::Capacity(local_3c0.ptr);
        uVar14 = local_358._16_8_;
        local_358._0_16_ = (undefined1  [16])0x0;
        local_358._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14);
        }
        local_440.ptr = (ValidityMask *)local_358;
        local_358._24_8_ = iVar33;
      }
      local_4d0 = 0;
      lVar48 = 0;
      do {
        pSVar25 = local_150.sel;
        psVar10 = (local_1a8.sel)->sel_vector;
        uVar30 = 0;
        do {
          uVar60 = uVar30;
          if (local_3b8.sel_vector != (sel_t *)0x0) {
            uVar60 = (ulong)local_3b8.sel_vector[uVar30];
          }
          if (psVar10 != (sel_t *)0x0) {
            uVar60 = (ulong)psVar10[uVar60];
          }
          iVar39 = (int)lVar48;
          local_370.sel_vector[uVar30] = *(int *)((long)local_1a8.data + uVar60 * 2 * 8) + iVar39;
          uVar30 = uVar30 + 1;
        } while (uVar50 != uVar30);
        puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector)->
                 validity_mask;
        uVar30 = 0;
        do {
          uVar60 = uVar30;
          if (local_3b8.sel_vector != (sel_t *)0x0) {
            uVar60 = (ulong)local_3b8.sel_vector[uVar30];
          }
          if (puVar2 != (unsigned_long *)0x0) {
            uVar60 = (ulong)*(uint *)((long)puVar2 + uVar60 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_388.sel_vector)->
                          validity_mask + uVar30 * 4) =
               *(int *)(local_1f0.data + uVar60 * 0x10) + iVar39;
          uVar30 = uVar30 + 1;
        } while (uVar50 != uVar30);
        uVar30 = 0;
        uVar60 = 0;
        lVar32 = 0;
        lVar59 = 0;
        do {
          uVar28 = uVar30;
          if (local_3b8.sel_vector != (sel_t *)0x0) {
            uVar28 = (ulong)local_3b8.sel_vector[uVar30];
          }
          uVar18 = uVar28;
          if (psVar10 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar10[uVar28];
          }
          uVar53 = uVar28;
          if (puVar2 != (unsigned_long *)0x0) {
            uVar53 = (ulong)*(uint *)((long)puVar2 + uVar28 * 4);
          }
          if ((*(long *)((long)pdVar9 + (uVar18 * 2 + 1) * 8) == lVar48) ||
             (*(long *)(pdVar7 + uVar53 * 0x10 + 8) == lVar48)) {
            if ((SelectionVector *)local_3a0.sel_vector != (SelectionVector *)0x0) {
              uVar28 = (ulong)*(uint *)((long)(sel_t **)local_3a0.sel_vector + uVar28 * 4);
            }
            if (*(long *)((long)pdVar9 + (uVar18 * 2 + 1) * 8) ==
                *(long *)(pdVar7 + uVar53 * 0x10 + 8)) {
              if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_150.sel)->sel_vector)->sel_vector +
                        lVar32 * 4) = (int)uVar28;
              }
              lVar32 = lVar32 + 1;
            }
            else {
              if ((OptionalSelection *)local_210.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_210.sel)->sel_vector)->sel_vector +
                        lVar59 * 4) = (int)uVar28;
              }
              lVar59 = lVar59 + 1;
            }
          }
          else {
            *(int *)(local_358._40_8_ + uVar60 * 4) = (int)uVar28;
            uVar60 = uVar60 + 1;
          }
          uVar30 = uVar30 + 1;
        } while (uVar50 != uVar30);
        if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
          pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
          }
          pSVar25->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar32 * 4);
        }
        pSVar25 = local_210.sel;
        if ((OptionalSelection *)local_210.sel != (OptionalSelection *)0x0) {
          pSVar4 = (SelectionVector *)(local_210.sel)->sel_vector;
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_210.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_210.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_210.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
          }
          pSVar25->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar59 * 4);
        }
        null_mask_00.ptr = local_440.ptr;
        if (uVar60 < uVar50) {
          if (uVar60 == 0) {
            uVar50 = 0;
          }
          else {
            uVar50 = 0;
            do {
              sVar46 = (sel_t)uVar50;
              if (local_358._40_8_ != 0) {
                sVar46 = *(sel_t *)(local_358._40_8_ + uVar50 * 4);
              }
              local_3b8.sel_vector[uVar50] = sVar46;
              uVar50 = uVar50 + 1;
            } while (uVar60 != uVar50);
            psVar10 = (local_1a8.sel)->sel_vector;
            uVar50 = 0;
            do {
              uVar30 = uVar50;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)local_3b8.sel_vector[uVar50];
              }
              if (psVar10 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar10[uVar30];
              }
              local_370.sel_vector[uVar50] =
                   *(int *)((long)local_1a8.data + uVar30 * 2 * 8) + iVar39;
              uVar50 = uVar50 + 1;
            } while (uVar60 != uVar50);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector)->
                     validity_mask;
            uVar30 = 0;
            do {
              uVar50 = uVar30;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar50 = (ulong)local_3b8.sel_vector[uVar30];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar50 = (ulong)*(uint *)((long)puVar2 + uVar50 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_388.sel_vector)->
                              validity_mask + uVar30 * 4) =
                   *(int *)(local_1f0.data + uVar50 * 0x10) + iVar39;
              uVar30 = uVar30 + 1;
              uVar50 = uVar60;
            } while (uVar60 != uVar30);
          }
        }
        ExtractNestedMask(&local_3b8,uVar50,&local_3a0,local_440.ptr,local_3c0);
        iVar33 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_318,(Vector *)local_298,&local_3b8,uVar50,&local_228,
                            (SelectionVector *)(local_358 + 0x28),null_mask_00);
        ExtractNestedMask(&local_3b8,uVar50,&local_3a0,null_mask_00.ptr,local_3c0);
        local_4d0 = local_4d0 + lVar32;
        uVar50 = uVar50 - iVar33;
        pSVar25 = &local_228;
        if (uVar50 == 0) {
          pSVar25 = &local_3b8;
        }
        ExtractNestedSelection
                  ((SelectionVector *)pSVar25->sel_vector,iVar33,
                   (SelectionVector *)local_3a0.sel_vector,(OptionalSelection *)local_210.sel);
        if (iVar33 != 0) {
          if (uVar50 == 0) break;
          uVar30 = 0;
          do {
            sVar46 = (sel_t)uVar30;
            if (local_358._40_8_ != 0) {
              sVar46 = *(sel_t *)(local_358._40_8_ + uVar30 * 4);
            }
            local_3b8.sel_vector[uVar30] = sVar46;
            uVar30 = uVar30 + 1;
          } while (uVar50 != uVar30);
        }
        lVar48 = lVar48 + 1;
      } while (uVar50 != 0);
LAB_00b58cf4:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._16_8_);
      }
      if (local_228.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_320 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_320);
      }
      if (local_3b8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3b8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1f0.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f0.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_1a8.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
      }
      if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
      }
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_298 + 8));
      if (local_318.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_318.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_318.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_318.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_318.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_318.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_318 + 8));
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
      }
      if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_438 + 8));
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
      }
      if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
      if (local_388.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_388.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_370.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_370.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar1 == STRUCT) {
        local_388.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar50 != 0) {
          _local_298 = (undefined1  [16])0x0;
          aLStack_290[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_1a8.sel = (SelectionVector *)0x0;
          local_1a8.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_1f0,uVar50);
          auVar13 = _DAT_012acff0;
          lVar48 = uVar50 - 1;
          auVar65._8_4_ = (int)lVar48;
          auVar65._0_8_ = lVar48;
          auVar65._12_4_ = (int)((ulong)lVar48 >> 0x20);
          uVar30 = 0;
          auVar65 = auVar65 ^ _DAT_012acff0;
          auVar69 = _DAT_012acfe0;
          do {
            auVar68 = auVar69 ^ auVar13;
            if ((bool)(~(auVar68._4_4_ == auVar65._4_4_ && auVar65._0_4_ < auVar68._0_4_ ||
                        auVar65._4_4_ < auVar68._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector)
                              ->validity_mask + uVar30 * 4) = (int)uVar30;
            }
            if ((auVar68._12_4_ != auVar65._12_4_ || auVar68._8_4_ <= auVar65._8_4_) &&
                auVar68._12_4_ <= auVar65._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector)
                              ->validity_mask + uVar30 * 4 + 4) = (int)uVar30 + 1;
            }
            uVar30 = uVar30 + 2;
            lVar48 = auVar69._8_8_;
            auVar69._0_8_ = auVar69._0_8_ + 2;
            auVar69._8_8_ = lVar48 + 2;
          } while ((uVar50 + 1 & 0xfffffffffffffffe) != uVar30);
          SelectionVector::SelectionVector((SelectionVector *)local_358,uVar50);
          SelectionVector::SelectionVector(&local_370,uVar50);
          local_318.vector_type = FLAT_VECTOR;
          local_318._1_7_ = 0;
          local_318.type.id_ = INVALID;
          local_318.type.physical_type_ = ~INVALID;
          local_318.type._2_6_ = 0;
          local_318.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_318.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_388.sel_vector == (ValidityMask *)0x0) {
            local_4c8.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_388);
            p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_388.sel_vector);
            peVar15 = local_318.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_318.vector_type = FLAT_VECTOR;
            local_318._1_7_ = 0;
            local_318.type.id_ = INVALID;
            local_318.type.physical_type_ = ~INVALID;
            local_318.type._2_6_ = 0;
            local_318.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar15 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            }
            local_4c8.ptr = (ValidityMask *)&local_318;
            local_318.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var21;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4d0 = 0;
          }
          else {
            __n = 0;
            local_4d0 = 0;
            iVar33 = uVar50;
            do {
              pvVar23 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar24 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar23);
              Vector::Vector((Vector *)local_4a8,pVVar24);
              Vector::Flatten((Vector *)local_4a8,uVar50);
              Vector::Slice((Vector *)local_4a8,(SelectionVector *)&local_1f0,iVar33);
              pvVar23 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar24 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar23);
              Vector::Vector((Vector *)local_438,pVVar24);
              Vector::Flatten((Vector *)local_438,uVar50);
              Vector::Slice((Vector *)local_438,(SelectionVector *)&local_1f0,iVar33);
              ExtractNestedMask((SelectionVector *)&local_1f0,iVar33,&local_3a0,local_4c8.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_388.sel_vector);
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar49 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_4a8,(Vector *)local_438,
                                    (SelectionVector *)&local_1f0,iVar33,&local_370,
                                    (SelectionVector *)local_358,local_4c8);
                ExtractNestedMask((SelectionVector *)&local_1f0,iVar33,&local_3a0,local_4c8.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_388.sel_vector);
                oVar26.ptr = (SelectionVector *)local_358;
                if (iVar49 == 0) {
                  oVar26.ptr = (SelectionVector *)&local_1f0;
                }
                iVar52 = iVar33 - iVar49;
                oVar58.ptr = &local_370;
                if (iVar52 == 0) {
                  oVar58.ptr = (SelectionVector *)&local_1f0;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar26.ptr)->sel_vector,iVar52,
                           (SelectionVector *)local_3a0.sel_vector,
                           (OptionalSelection *)local_150.sel);
                ExtractNestedSelection
                          ((SelectionVector *)(oVar58.ptr)->sel_vector,iVar49,
                           (SelectionVector *)local_3a0.sel_vector,
                           (OptionalSelection *)local_210.sel);
                local_4d0 = local_4d0 + iVar52;
              }
              else {
                iVar49 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_4a8,(Vector *)local_438,
                                    (SelectionVector *)&local_1f0,iVar33,&local_370,
                                    (SelectionVector *)local_358,local_4c8);
                ExtractNestedMask((SelectionVector *)&local_1f0,iVar33,&local_3a0,local_4c8.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_388.sel_vector);
                iVar33 = iVar33 - iVar49;
                oVar26.ptr = &local_370;
                if (iVar33 == 0) {
                  oVar26.ptr = (SelectionVector *)&local_1f0;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar26.ptr)->sel_vector,iVar49,
                           (SelectionVector *)local_3a0.sel_vector,
                           (OptionalSelection *)local_210.sel);
                if (iVar49 != 0) {
                  if (iVar33 == 0) {
                    iVar33 = 0;
                  }
                  else {
                    iVar49 = 0;
                    do {
                      uVar34 = (undefined4)iVar49;
                      if ((_func_int **)local_358._0_8_ != (_func_int **)0x0) {
                        uVar34 = *(undefined4 *)(local_358._0_8_ + iVar49 * 4);
                      }
                      *(undefined4 *)
                       ((long)&((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector
                               )->validity_mask + iVar49 * 4) = uVar34;
                      iVar49 = iVar49 + 1;
                    } while (iVar33 != iVar49);
                  }
                }
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
              }
              if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_438 + 8));
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
              }
              if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_318.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_318.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_370.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_370.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_1a8);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_298);
          goto LAB_00b58eae;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_4a8);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar50 != 0) {
          iVar33 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_370,uVar50);
          SelectionVector::SelectionVector(&local_388,uVar50);
          pVVar20 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_4a8,pVVar20);
          pVVar20 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_438,pVVar20);
          iVar49 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_4a8,iVar49);
          iVar49 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_438,iVar49);
          Vector::Vector(&local_318,(Vector *)local_4a8,&local_370,uVar50);
          Vector::Vector((Vector *)local_298,(Vector *)local_438,&local_388,uVar50);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_1a8);
          Vector::ToUnifiedFormat(&local_100,uVar50,&local_1a8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_1f0);
          Vector::ToUnifiedFormat(&local_98,uVar50,&local_1f0);
          SelectionVector::SelectionVector(&local_3b8,uVar50);
          auVar13 = _DAT_012acff0;
          lVar48 = uVar50 - 1;
          auVar64._8_4_ = (int)lVar48;
          auVar64._0_8_ = lVar48;
          auVar64._12_4_ = (int)((ulong)lVar48 >> 0x20);
          uVar30 = 0;
          auVar64 = auVar64 ^ _DAT_012acff0;
          auVar67 = _DAT_012acfe0;
          do {
            auVar68 = auVar67 ^ auVar13;
            if ((bool)(~(auVar68._4_4_ == auVar64._4_4_ && auVar64._0_4_ < auVar68._0_4_ ||
                        auVar64._4_4_ < auVar68._4_4_) & 1)) {
              local_3b8.sel_vector[uVar30] = (sel_t)uVar30;
            }
            if ((auVar68._12_4_ != auVar64._12_4_ || auVar68._8_4_ <= auVar64._8_4_) &&
                auVar68._12_4_ <= auVar64._12_4_) {
              local_3b8.sel_vector[uVar30 + 1] = (sel_t)uVar30 + 1;
            }
            uVar30 = uVar30 + 2;
            lVar48 = auVar67._8_8_;
            auVar67._0_8_ = auVar67._0_8_ + 2;
            auVar67._8_8_ = lVar48 + 2;
          } while ((uVar50 + 1 & 0xfffffffffffffffe) != uVar30);
          SelectionVector::SelectionVector((SelectionVector *)(local_358 + 0x28),uVar50);
          SelectionVector::SelectionVector(&local_228,uVar50);
          local_358._0_16_ = (undefined1  [16])0x0;
          local_358._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_358._24_8_ = 0x800;
          if (local_3c0.ptr == (ValidityMask *)0x0) {
            local_4d8 = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
            iVar49 = ValidityMask::Capacity(local_3c0.ptr);
            uVar14 = local_358._16_8_;
            local_358._0_16_ = (undefined1  [16])0x0;
            local_358._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14);
            }
            local_4d8 = (ValidityMask *)local_358;
            local_358._24_8_ = iVar49;
          }
          iVar49 = 0;
          local_4d0 = 0;
          do {
            pSVar25 = local_150.sel;
            psVar10 = (local_1a8.sel)->sel_vector;
            uVar30 = 0;
            do {
              uVar60 = uVar30;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3b8.sel_vector[uVar30];
              }
              if (psVar10 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar10[uVar60];
              }
              iVar56 = (int)iVar33;
              iVar39 = (int)iVar49;
              local_370.sel_vector[uVar30] = (int)uVar60 * iVar56 + iVar39;
              uVar30 = uVar30 + 1;
            } while (uVar50 != uVar30);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector)->
                     validity_mask;
            uVar30 = 0;
            do {
              uVar60 = uVar30;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3b8.sel_vector[uVar30];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar60 = (ulong)*(uint *)((long)puVar2 + uVar60 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_388.sel_vector)->
                              validity_mask + uVar30 * 4) = (int)uVar60 * iVar56 + iVar39;
              uVar30 = uVar30 + 1;
            } while (uVar50 != uVar30);
            uVar30 = 0;
            uVar60 = 0;
            lVar48 = 0;
            do {
              uVar28 = uVar30;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar28 = (ulong)local_3b8.sel_vector[uVar30];
              }
              if (iVar33 == iVar49) {
                if ((SelectionVector *)local_3a0.sel_vector != (SelectionVector *)0x0) {
                  uVar28 = (ulong)*(uint *)((long)(sel_t **)local_3a0.sel_vector + uVar28 * 4);
                }
                if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
                  *(int *)((long)&((SelectionVector *)(local_150.sel)->sel_vector)->sel_vector +
                          lVar48 * 4) = (int)uVar28;
                }
                lVar48 = lVar48 + 1;
              }
              else {
                *(int *)(local_358._40_8_ + uVar60 * 4) = (int)uVar28;
                uVar60 = uVar60 + 1;
              }
              uVar30 = uVar30 + 1;
            } while (uVar50 != uVar30);
            if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
              pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
              }
              pSVar25->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar48 * 4);
            }
            pSVar25 = local_210.sel;
            if ((OptionalSelection *)local_210.sel != (OptionalSelection *)0x0) {
              pSVar4 = (SelectionVector *)(local_210.sel)->sel_vector;
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_210.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_210.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_210.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
              }
              pSVar25->sel_vector = (sel_t *)pSVar4;
            }
            if (uVar60 < uVar50) {
              if (uVar60 == 0) {
                uVar50 = 0;
              }
              else {
                uVar50 = 0;
                do {
                  sVar46 = (sel_t)uVar50;
                  if (local_358._40_8_ != 0) {
                    sVar46 = *(sel_t *)(local_358._40_8_ + uVar50 * 4);
                  }
                  local_3b8.sel_vector[uVar50] = sVar46;
                  uVar50 = uVar50 + 1;
                } while (uVar60 != uVar50);
                psVar10 = (local_1a8.sel)->sel_vector;
                uVar50 = 0;
                do {
                  uVar30 = uVar50;
                  if (local_3b8.sel_vector != (sel_t *)0x0) {
                    uVar30 = (ulong)local_3b8.sel_vector[uVar50];
                  }
                  if (psVar10 != (sel_t *)0x0) {
                    uVar30 = (ulong)psVar10[uVar30];
                  }
                  local_370.sel_vector[uVar50] = (int)uVar30 * iVar56 + iVar39;
                  uVar50 = uVar50 + 1;
                } while (uVar60 != uVar50);
                puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_1f0.sel)->sel_vector)->
                         validity_mask;
                uVar30 = 0;
                do {
                  uVar50 = uVar30;
                  if (local_3b8.sel_vector != (sel_t *)0x0) {
                    uVar50 = (ulong)local_3b8.sel_vector[uVar30];
                  }
                  if (puVar2 != (unsigned_long *)0x0) {
                    uVar50 = (ulong)*(uint *)((long)puVar2 + uVar50 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_388.sel_vector)->
                                  validity_mask + uVar30 * 4) = (int)uVar50 * iVar56 + iVar39;
                  uVar30 = uVar30 + 1;
                  uVar50 = uVar60;
                } while (uVar60 != uVar30);
              }
            }
            ExtractNestedMask(&local_3b8,uVar50,&local_3a0,local_4d8,local_3c0);
            iVar52 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_318,(Vector *)local_298,&local_3b8,uVar50,&local_228,
                                (SelectionVector *)(local_358 + 0x28),local_3c0);
            ExtractNestedMask(&local_3b8,uVar50,&local_3a0,local_4d8,local_3c0);
            local_4d0 = local_4d0 + lVar48;
            uVar50 = uVar50 - iVar52;
            oVar26.ptr = &local_228;
            if (uVar50 == 0) {
              oVar26.ptr = &local_3b8;
            }
            ExtractNestedSelection
                      ((SelectionVector *)(oVar26.ptr)->sel_vector,iVar52,
                       (SelectionVector *)local_3a0.sel_vector,(OptionalSelection *)local_210.sel);
            if (iVar52 != 0) {
              if (uVar50 == 0) break;
              uVar30 = 0;
              do {
                uVar60 = uVar30;
                if (local_358._40_8_ != 0) {
                  uVar60 = (ulong)*(uint *)(local_358._40_8_ + uVar30 * 4);
                }
                local_3b8.sel_vector[uVar30] = (sel_t)uVar60;
                uVar30 = uVar30 + 1;
              } while (uVar50 != uVar30);
            }
            iVar49 = iVar49 + 1;
          } while (uVar50 != 0);
          goto LAB_00b58cf4;
        }
      }
LAB_00b54d3f:
      local_4d0 = 0;
    }
LAB_00b58eae:
    local_4d0 = local_4d0 + local_4b0;
    if ((local_2a8.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_2a8), local_4d0 != 0)) {
      psVar10 = (local_2a8.ptr)->sel_vector;
      iVar33 = 0;
      do {
        sVar46 = (sel_t)iVar33;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar46 = local_118.sel_vector[iVar33];
        }
        psVar10[iVar33] = sVar46;
        iVar33 = iVar33 + 1;
      } while (local_4d0 != iVar33);
    }
    if (local_2b0.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_2b0);
      if (count != local_4d0) {
        psVar10 = (local_2b0.ptr)->sel_vector;
        lVar48 = 0;
        do {
          sVar46 = (sel_t)lVar48;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar46 = local_130.sel_vector[lVar48];
          }
          psVar10[lVar48] = sVar46;
          lVar48 = lVar48 + 1;
        } while (count - local_4d0 != lVar48);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_3a0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3a0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_210.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_210.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_150.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_00b62267;
  }
LAB_00b5fb8e:
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
joined_r0x00b5fa2f:
  if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
  }
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_488._M_pi;
  if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_488._M_pi;
  }
LAB_00b62267:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return local_4d0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}